

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  bool bVar49;
  uint uVar50;
  ulong uVar51;
  byte bVar52;
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  long lVar56;
  uint uVar57;
  ulong uVar58;
  LinearSpace3fa *pLVar59;
  bool bVar60;
  float fVar61;
  undefined4 uVar62;
  float fVar63;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  float fVar88;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar89;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar121;
  vint4 ai_2;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar143;
  vint4 ai;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar144;
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar173;
  float fVar174;
  vfloat4 b0;
  float fVar175;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar186;
  vfloat4 a0_3;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar179 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar187;
  undefined1 auVar185 [32];
  float fVar191;
  float fVar204;
  vint4 ai_1;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar205;
  float fVar221;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar222;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  __m128 a;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  vfloat4 a0_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar244 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar253;
  float fVar263;
  float fVar264;
  vfloat4 a0;
  undefined1 auVar254 [16];
  float fVar265;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar281 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined1 local_558 [32];
  undefined1 local_508 [16];
  undefined1 (*local_4f8) [16];
  LinearSpace3fa *local_4f0;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [16];
  uint auStack_3e8 [4];
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint uStack_208;
  float afStack_204 [7];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar280 [32];
  
  PVar2 = prim[1];
  uVar55 = (ulong)(byte)PVar2;
  fVar61 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar7 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar7 = vsubps_avx(auVar7,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar237._0_4_ = fVar61 * auVar7._0_4_;
  auVar237._4_4_ = fVar61 * auVar7._4_4_;
  auVar237._8_4_ = fVar61 * auVar7._8_4_;
  auVar237._12_4_ = fVar61 * auVar7._12_4_;
  auVar124._0_4_ = fVar61 * auVar8._0_4_;
  auVar124._4_4_ = fVar61 * auVar8._4_4_;
  auVar124._8_4_ = fVar61 * auVar8._8_4_;
  auVar124._12_4_ = fVar61 * auVar8._12_4_;
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar277 = vcvtdq2ps_avx(auVar277);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar55 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar51 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + uVar55 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar51 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar266._4_4_ = auVar124._0_4_;
  auVar266._0_4_ = auVar124._0_4_;
  auVar266._8_4_ = auVar124._0_4_;
  auVar266._12_4_ = auVar124._0_4_;
  auVar92 = vshufps_avx(auVar124,auVar124,0x55);
  auVar245 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar61 = auVar245._0_4_;
  auVar235._0_4_ = fVar61 * auVar277._0_4_;
  fVar84 = auVar245._4_4_;
  auVar235._4_4_ = fVar84 * auVar277._4_4_;
  fVar86 = auVar245._8_4_;
  auVar235._8_4_ = fVar86 * auVar277._8_4_;
  fVar88 = auVar245._12_4_;
  auVar235._12_4_ = fVar88 * auVar277._12_4_;
  auVar223._0_4_ = auVar12._0_4_ * fVar61;
  auVar223._4_4_ = auVar12._4_4_ * fVar84;
  auVar223._8_4_ = auVar12._8_4_ * fVar86;
  auVar223._12_4_ = auVar12._12_4_ * fVar88;
  auVar192._0_4_ = auVar109._0_4_ * fVar61;
  auVar192._4_4_ = auVar109._4_4_ * fVar84;
  auVar192._8_4_ = auVar109._8_4_ * fVar86;
  auVar192._12_4_ = auVar109._12_4_ * fVar88;
  auVar245 = vfmadd231ps_fma(auVar235,auVar92,auVar8);
  auVar73 = vfmadd231ps_fma(auVar223,auVar92,auVar11);
  auVar92 = vfmadd231ps_fma(auVar192,auVar64,auVar92);
  auVar122 = vfmadd231ps_fma(auVar245,auVar266,auVar7);
  auVar73 = vfmadd231ps_fma(auVar73,auVar266,auVar10);
  auVar134 = vfmadd231ps_fma(auVar92,auVar65,auVar266);
  auVar267._4_4_ = auVar237._0_4_;
  auVar267._0_4_ = auVar237._0_4_;
  auVar267._8_4_ = auVar237._0_4_;
  auVar267._12_4_ = auVar237._0_4_;
  auVar92 = vshufps_avx(auVar237,auVar237,0x55);
  auVar245 = vshufps_avx(auVar237,auVar237,0xaa);
  fVar61 = auVar245._0_4_;
  auVar145._0_4_ = fVar61 * auVar277._0_4_;
  fVar84 = auVar245._4_4_;
  auVar145._4_4_ = fVar84 * auVar277._4_4_;
  fVar86 = auVar245._8_4_;
  auVar145._8_4_ = fVar86 * auVar277._8_4_;
  fVar88 = auVar245._12_4_;
  auVar145._12_4_ = fVar88 * auVar277._12_4_;
  auVar91._0_4_ = auVar12._0_4_ * fVar61;
  auVar91._4_4_ = auVar12._4_4_ * fVar84;
  auVar91._8_4_ = auVar12._8_4_ * fVar86;
  auVar91._12_4_ = auVar12._12_4_ * fVar88;
  auVar245._0_4_ = auVar109._0_4_ * fVar61;
  auVar245._4_4_ = auVar109._4_4_ * fVar84;
  auVar245._8_4_ = auVar109._8_4_ * fVar86;
  auVar245._12_4_ = auVar109._12_4_ * fVar88;
  auVar8 = vfmadd231ps_fma(auVar145,auVar92,auVar8);
  auVar277 = vfmadd231ps_fma(auVar91,auVar92,auVar11);
  auVar11 = vfmadd231ps_fma(auVar245,auVar92,auVar64);
  auVar12 = vfmadd231ps_fma(auVar8,auVar267,auVar7);
  auVar64 = vfmadd231ps_fma(auVar277,auVar267,auVar10);
  auVar109 = vfmadd231ps_fma(auVar11,auVar267,auVar65);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx(auVar122,auVar242);
  auVar133._8_4_ = 0x219392ef;
  auVar133._0_8_ = 0x219392ef219392ef;
  auVar133._12_4_ = 0x219392ef;
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar8 = vblendvps_avx(auVar122,auVar133,auVar7);
  auVar7 = vandps_avx(auVar73,auVar242);
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar277 = vblendvps_avx(auVar73,auVar133,auVar7);
  auVar7 = vandps_avx(auVar134,auVar242);
  auVar7 = vcmpps_avx(auVar7,auVar133,1);
  auVar7 = vblendvps_avx(auVar134,auVar133,auVar7);
  auVar10 = vrcpps_avx(auVar8);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar8,auVar10,auVar176);
  auVar10 = vfmadd132ps_fma(auVar8,auVar10,auVar10);
  auVar8 = vrcpps_avx(auVar277);
  auVar277 = vfnmadd213ps_fma(auVar277,auVar8,auVar176);
  auVar11 = vfmadd132ps_fma(auVar277,auVar8,auVar8);
  auVar8 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar8,auVar176);
  auVar65 = vfmadd132ps_fma(auVar7,auVar8,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar7 = vpmovsxwd_avx(auVar7);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar134._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar134._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar134._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar134._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar7 = vpmovsxwd_avx(auVar8);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar12);
  auVar146._0_4_ = auVar10._0_4_ * auVar7._0_4_;
  auVar146._4_4_ = auVar10._4_4_ * auVar7._4_4_;
  auVar146._8_4_ = auVar10._8_4_ * auVar7._8_4_;
  auVar146._12_4_ = auVar10._12_4_ * auVar7._12_4_;
  auVar73._1_3_ = 0;
  auVar73[0] = PVar2;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar277);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar55 * -2 + 6);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar64);
  auVar193._0_4_ = auVar7._0_4_ * auVar11._0_4_;
  auVar193._4_4_ = auVar7._4_4_ * auVar11._4_4_;
  auVar193._8_4_ = auVar7._8_4_ * auVar11._8_4_;
  auVar193._12_4_ = auVar7._12_4_ * auVar11._12_4_;
  auVar7 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar7,auVar64);
  auVar92._0_4_ = auVar11._0_4_ * auVar7._0_4_;
  auVar92._4_4_ = auVar11._4_4_ * auVar7._4_4_;
  auVar92._8_4_ = auVar11._8_4_ * auVar7._8_4_;
  auVar92._12_4_ = auVar11._12_4_ * auVar7._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar51 + uVar55 + 6);
  auVar7 = vpmovsxwd_avx(auVar11);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar109);
  auVar122._0_4_ = auVar65._0_4_ * auVar7._0_4_;
  auVar122._4_4_ = auVar65._4_4_ * auVar7._4_4_;
  auVar122._8_4_ = auVar65._8_4_ * auVar7._8_4_;
  auVar122._12_4_ = auVar65._12_4_ * auVar7._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar7 = vpmovsxwd_avx(auVar12);
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar7 = vsubps_avx(auVar7,auVar109);
  auVar64._0_4_ = auVar65._0_4_ * auVar7._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar7._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar7._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar7._12_4_;
  auVar7 = vpminsd_avx(auVar134,auVar146);
  auVar8 = vpminsd_avx(auVar193,auVar92);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vpminsd_avx(auVar122,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar206._4_4_ = uVar62;
  auVar206._0_4_ = uVar62;
  auVar206._8_4_ = uVar62;
  auVar206._12_4_ = uVar62;
  auVar8 = vmaxps_avx(auVar8,auVar206);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  local_348._0_4_ = auVar7._0_4_ * 0.99999964;
  local_348._4_4_ = auVar7._4_4_ * 0.99999964;
  local_348._8_4_ = auVar7._8_4_ * 0.99999964;
  local_348._12_4_ = auVar7._12_4_ * 0.99999964;
  auVar7 = vpmaxsd_avx(auVar134,auVar146);
  auVar8 = vpmaxsd_avx(auVar193,auVar92);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar8 = vpmaxsd_avx(auVar122,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar109._4_4_ = uVar62;
  auVar109._0_4_ = uVar62;
  auVar109._8_4_ = uVar62;
  auVar109._12_4_ = uVar62;
  auVar8 = vminps_avx(auVar8,auVar109);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar65._0_4_ = auVar7._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar7._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar7._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar7._12_4_ * 1.0000004;
  auVar73[4] = PVar2;
  auVar73._5_3_ = 0;
  auVar73[8] = PVar2;
  auVar73._9_3_ = 0;
  auVar73[0xc] = PVar2;
  auVar73._13_3_ = 0;
  auVar8 = vpcmpgtd_avx(auVar73,_DAT_01f7fcf0);
  auVar7 = vcmpps_avx(local_348,auVar65,2);
  auVar7 = vandps_avx(auVar7,auVar8);
  uVar50 = vmovmskps_avx(auVar7);
  if (uVar50 == 0) {
    return false;
  }
  uVar50 = uVar50 & 0xff;
  auVar81._16_16_ = mm_lookupmask_ps._240_16_;
  auVar81._0_16_ = mm_lookupmask_ps._240_16_;
  pLVar59 = pre->ray_space + k;
  local_158 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
  local_4f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_4f0 = pLVar59;
LAB_015fc57c:
  lVar56 = 0;
  for (uVar51 = (ulong)uVar50; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar54 = *(uint *)(prim + 2);
  local_368 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar54].ptr;
  lVar4 = *(long *)&pGVar3[1].time_range.upper;
  uVar51 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)local_368 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar7 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar51);
  lVar56 = uVar51 + 1;
  auVar8 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * lVar56);
  _Var5 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar277 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * uVar51);
  auVar10 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * lVar56);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar274._8_4_ = 0x3eaaaaab;
  auVar274._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar274._12_4_ = 0x3eaaaaab;
  auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar3[2].intersectionFilterN +
                             (long)pGVar3[2].pointQueryFunc * uVar51),auVar7,auVar274);
  auVar92 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar3[2].intersectionFilterN +
                              (long)pGVar3[2].pointQueryFunc * lVar56),auVar8,auVar274);
  auVar65 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar3[3].userPtr +
                             uVar51 * *(long *)&pGVar3[3].fnumTimeSegments),auVar277,auVar274);
  auVar245 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar3[3].userPtr +
                               *(long *)&pGVar3[3].fnumTimeSegments * lVar56),auVar10,auVar274);
  auVar66._12_4_ = 0;
  auVar66._0_12_ = ZEXT812(0);
  auVar66 = auVar66 << 0x20;
  auVar93._0_4_ = auVar8._0_4_ * 0.0;
  auVar93._4_4_ = auVar8._4_4_ * 0.0;
  auVar93._8_4_ = auVar8._8_4_ * 0.0;
  auVar93._12_4_ = auVar8._12_4_ * 0.0;
  auVar109 = vfmadd231ps_fma(auVar93,auVar92,auVar66);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar12,auVar109);
  local_648._0_4_ = auVar7._0_4_ + auVar64._0_4_;
  local_648._4_4_ = auVar7._4_4_ + auVar64._4_4_;
  uStack_640._0_4_ = auVar7._8_4_ + auVar64._8_4_;
  uStack_640._4_4_ = auVar7._12_4_ + auVar64._12_4_;
  auVar268._8_4_ = 0x40400000;
  auVar268._0_8_ = 0x4040000040400000;
  auVar268._12_4_ = 0x40400000;
  auVar64 = vfmadd231ps_fma(auVar109,auVar12,auVar268);
  auVar73 = vfnmadd231ps_fma(auVar64,auVar7,auVar268);
  auVar236._0_4_ = auVar10._0_4_ * 0.0;
  auVar236._4_4_ = auVar10._4_4_ * 0.0;
  auVar236._8_4_ = auVar10._8_4_ * 0.0;
  auVar236._12_4_ = auVar10._12_4_ * 0.0;
  auVar109 = vfmadd231ps_fma(auVar236,auVar245,auVar66);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar65,auVar109);
  auVar254._0_4_ = auVar277._0_4_ + auVar64._0_4_;
  auVar254._4_4_ = auVar277._4_4_ + auVar64._4_4_;
  auVar254._8_4_ = auVar277._8_4_ + auVar64._8_4_;
  auVar254._12_4_ = auVar277._12_4_ + auVar64._12_4_;
  auVar64 = vfmadd231ps_fma(auVar109,auVar65,auVar268);
  auVar109 = vfnmadd231ps_fma(auVar64,auVar277,auVar268);
  auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar92,auVar8);
  auVar64 = vfmadd231ps_fma(auVar64,auVar12,auVar66);
  auVar64 = vfmadd231ps_fma(auVar64,auVar7,auVar66);
  auVar135._0_4_ = auVar8._0_4_ * 3.0;
  auVar135._4_4_ = auVar8._4_4_ * 3.0;
  auVar135._8_4_ = auVar8._8_4_ * 3.0;
  auVar135._12_4_ = auVar8._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar135,auVar268,auVar92);
  auVar8 = vfmadd231ps_fma(auVar8,auVar66,auVar12);
  auVar92 = vfnmadd231ps_fma(auVar8,auVar66,auVar7);
  auVar7 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar245,auVar10);
  auVar7 = vfmadd231ps_fma(auVar7,auVar65,auVar66);
  auVar12 = vfmadd231ps_fma(auVar7,auVar277,auVar66);
  auVar177._0_4_ = auVar10._0_4_ * 3.0;
  auVar177._4_4_ = auVar10._4_4_ * 3.0;
  auVar177._8_4_ = auVar10._8_4_ * 3.0;
  auVar177._12_4_ = auVar10._12_4_ * 3.0;
  auVar7 = vfnmadd231ps_fma(auVar177,auVar268,auVar245);
  auVar7 = vfmadd231ps_fma(auVar7,auVar66,auVar65);
  auVar245 = vfnmadd231ps_fma(auVar7,auVar66,auVar277);
  auVar7 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar8 = vshufps_avx(auVar254,auVar254,0xc9);
  fVar61 = auVar73._0_4_;
  auVar194._0_4_ = auVar8._0_4_ * fVar61;
  fVar86 = auVar73._4_4_;
  auVar194._4_4_ = auVar8._4_4_ * fVar86;
  fVar121 = auVar73._8_4_;
  auVar194._8_4_ = auVar8._8_4_ * fVar121;
  fVar87 = auVar73._12_4_;
  auVar194._12_4_ = auVar8._12_4_ * fVar87;
  auVar8 = vfmsub231ps_fma(auVar194,auVar7,auVar254);
  auVar277 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar207._0_4_ = auVar8._0_4_ * fVar61;
  auVar207._4_4_ = auVar8._4_4_ * fVar86;
  auVar207._8_4_ = auVar8._8_4_ * fVar121;
  auVar207._12_4_ = auVar8._12_4_ * fVar87;
  auVar7 = vfmsub231ps_fma(auVar207,auVar7,auVar109);
  auVar10 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar8 = vshufps_avx(auVar92,auVar92,0xc9);
  auVar7 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar84 = auVar92._0_4_;
  auVar224._0_4_ = auVar7._0_4_ * fVar84;
  fVar88 = auVar92._4_4_;
  auVar224._4_4_ = auVar7._4_4_ * fVar88;
  fVar85 = auVar92._8_4_;
  auVar224._8_4_ = auVar7._8_4_ * fVar85;
  fVar144 = auVar92._12_4_;
  auVar224._12_4_ = auVar7._12_4_ * fVar144;
  auVar7 = vfmsub231ps_fma(auVar224,auVar8,auVar12);
  auVar12 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar65 = vshufps_avx(auVar245,auVar245,0xc9);
  auVar7 = vdpps_avx(auVar277,auVar277,0x7f);
  auVar225._0_4_ = auVar65._0_4_ * fVar84;
  auVar225._4_4_ = auVar65._4_4_ * fVar88;
  auVar225._8_4_ = auVar65._8_4_ * fVar85;
  auVar225._12_4_ = auVar65._12_4_ * fVar144;
  auVar8 = vfmsub231ps_fma(auVar225,auVar8,auVar245);
  auVar65 = vshufps_avx(auVar8,auVar8,0xc9);
  fVar222 = auVar7._0_4_;
  auVar109 = ZEXT416((uint)fVar222);
  auVar8 = vrsqrtss_avx(auVar109,auVar109);
  fVar63 = auVar8._0_4_;
  fVar132 = fVar63 * 1.5 - fVar222 * 0.5 * fVar63 * fVar63 * fVar63;
  auVar8 = vdpps_avx(auVar277,auVar10,0x7f);
  fVar158 = auVar277._0_4_ * fVar132;
  fVar173 = auVar277._4_4_ * fVar132;
  fVar174 = auVar277._8_4_ * fVar132;
  fVar175 = auVar277._12_4_ * fVar132;
  auVar208._0_4_ = fVar222 * auVar10._0_4_;
  auVar208._4_4_ = fVar222 * auVar10._4_4_;
  auVar208._8_4_ = fVar222 * auVar10._8_4_;
  auVar208._12_4_ = fVar222 * auVar10._12_4_;
  fVar63 = auVar8._0_4_;
  auVar195._0_4_ = fVar63 * auVar277._0_4_;
  auVar195._4_4_ = fVar63 * auVar277._4_4_;
  auVar195._8_4_ = fVar63 * auVar277._8_4_;
  auVar195._12_4_ = fVar63 * auVar277._12_4_;
  auVar277 = vsubps_avx(auVar208,auVar195);
  auVar8 = vrcpss_avx(auVar109,auVar109);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,SUB6416(ZEXT464(0x40000000),0));
  fVar63 = auVar8._0_4_ * auVar7._0_4_;
  auVar7 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar222 = auVar7._0_4_;
  auVar109 = ZEXT416((uint)fVar222);
  auVar8 = vrsqrtss_avx(auVar109,auVar109);
  fVar143 = auVar8._0_4_;
  fVar143 = fVar143 * 1.5 - fVar222 * 0.5 * fVar143 * fVar143 * fVar143;
  auVar8 = vdpps_avx(auVar12,auVar65,0x7f);
  fVar253 = fVar143 * auVar12._0_4_;
  fVar263 = fVar143 * auVar12._4_4_;
  fVar264 = fVar143 * auVar12._8_4_;
  fVar265 = fVar143 * auVar12._12_4_;
  auVar178._0_4_ = fVar222 * auVar65._0_4_;
  auVar178._4_4_ = fVar222 * auVar65._4_4_;
  auVar178._8_4_ = fVar222 * auVar65._8_4_;
  auVar178._12_4_ = fVar222 * auVar65._12_4_;
  fVar222 = auVar8._0_4_;
  auVar147._0_4_ = fVar222 * auVar12._0_4_;
  auVar147._4_4_ = fVar222 * auVar12._4_4_;
  auVar147._8_4_ = fVar222 * auVar12._8_4_;
  auVar147._12_4_ = fVar222 * auVar12._12_4_;
  auVar10 = vsubps_avx(auVar178,auVar147);
  auVar8 = vrcpss_avx(auVar109,auVar109);
  auVar7 = vfnmadd213ss_fma(auVar7,auVar8,ZEXT416(0x40000000));
  fVar222 = auVar7._0_4_ * auVar8._0_4_;
  auVar7 = vshufps_avx(_local_648,_local_648,0xff);
  auVar209._0_4_ = auVar7._0_4_ * fVar158;
  auVar209._4_4_ = auVar7._4_4_ * fVar173;
  auVar209._8_4_ = auVar7._8_4_ * fVar174;
  auVar209._12_4_ = auVar7._12_4_ * fVar175;
  local_468 = vsubps_avx(_local_648,auVar209);
  auVar8 = vshufps_avx(auVar73,auVar73,0xff);
  auVar159._0_4_ = auVar8._0_4_ * fVar158 + fVar132 * auVar277._0_4_ * fVar63 * auVar7._0_4_;
  auVar159._4_4_ = auVar8._4_4_ * fVar173 + fVar132 * auVar277._4_4_ * fVar63 * auVar7._4_4_;
  auVar159._8_4_ = auVar8._8_4_ * fVar174 + fVar132 * auVar277._8_4_ * fVar63 * auVar7._8_4_;
  auVar159._12_4_ = auVar8._12_4_ * fVar175 + fVar132 * auVar277._12_4_ * fVar63 * auVar7._12_4_;
  auVar277 = vsubps_avx(auVar73,auVar159);
  local_478._0_4_ = auVar209._0_4_ + (float)local_648._0_4_;
  local_478._4_4_ = auVar209._4_4_ + (float)local_648._4_4_;
  fStack_470 = auVar209._8_4_ + (float)uStack_640;
  fStack_46c = auVar209._12_4_ + uStack_640._4_4_;
  auVar7 = vshufps_avx(auVar64,auVar64,0xff);
  auVar110._0_4_ = fVar253 * auVar7._0_4_;
  auVar110._4_4_ = fVar263 * auVar7._4_4_;
  auVar110._8_4_ = fVar264 * auVar7._8_4_;
  auVar110._12_4_ = fVar265 * auVar7._12_4_;
  local_488 = vsubps_avx(auVar64,auVar110);
  auVar8 = vshufps_avx(auVar92,auVar92,0xff);
  auVar94._0_4_ = fVar253 * auVar8._0_4_ + auVar7._0_4_ * fVar143 * auVar10._0_4_ * fVar222;
  auVar94._4_4_ = fVar263 * auVar8._4_4_ + auVar7._4_4_ * fVar143 * auVar10._4_4_ * fVar222;
  auVar94._8_4_ = fVar264 * auVar8._8_4_ + auVar7._8_4_ * fVar143 * auVar10._8_4_ * fVar222;
  auVar94._12_4_ = fVar265 * auVar8._12_4_ + auVar7._12_4_ * fVar143 * auVar10._12_4_ * fVar222;
  auVar7 = vsubps_avx(auVar92,auVar94);
  fVar158 = auVar64._0_4_ + auVar110._0_4_;
  fVar173 = auVar64._4_4_ + auVar110._4_4_;
  fVar174 = auVar64._8_4_ + auVar110._8_4_;
  fVar175 = auVar64._12_4_ + auVar110._12_4_;
  local_498._0_4_ = local_468._0_4_ + auVar277._0_4_ * 0.33333334;
  local_498._4_4_ = local_468._4_4_ + auVar277._4_4_ * 0.33333334;
  local_498._8_4_ = local_468._8_4_ + auVar277._8_4_ * 0.33333334;
  local_498._12_4_ = local_468._12_4_ + auVar277._12_4_ * 0.33333334;
  auVar95._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar95._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar95._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar95._12_4_ = auVar7._12_4_ * 0.33333334;
  local_4a8 = vsubps_avx(local_488,auVar95);
  local_448 = vsubps_avx(local_468,auVar11);
  auVar7 = vshufps_avx(local_448,local_448,0x55);
  auVar8 = vshufps_avx(local_448,local_448,0xaa);
  aVar1 = (pLVar59->vy).field_0;
  fVar63 = (pLVar59->vz).field_0.m128[0];
  fVar222 = *(float *)((long)&(pLVar59->vz).field_0 + 4);
  fVar132 = *(float *)((long)&(pLVar59->vz).field_0 + 8);
  fVar143 = *(float *)((long)&(pLVar59->vz).field_0 + 0xc);
  auVar96._0_4_ = fVar63 * auVar8._0_4_;
  auVar96._4_4_ = fVar222 * auVar8._4_4_;
  auVar96._8_4_ = fVar132 * auVar8._8_4_;
  auVar96._12_4_ = fVar143 * auVar8._12_4_;
  auVar277 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar1,auVar7);
  local_458 = vsubps_avx(local_498,auVar11);
  auVar7 = vshufps_avx(local_458,local_458,0x55);
  auVar8 = vshufps_avx(local_458,local_458,0xaa);
  auVar275._0_4_ = fVar63 * auVar8._0_4_;
  auVar275._4_4_ = fVar222 * auVar8._4_4_;
  auVar275._8_4_ = fVar132 * auVar8._8_4_;
  auVar275._12_4_ = fVar143 * auVar8._12_4_;
  auVar8 = vfmadd231ps_fma(auVar275,(undefined1  [16])aVar1,auVar7);
  local_2d8 = vsubps_avx(local_4a8,auVar11);
  auVar7 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar243._0_4_ = fVar63 * auVar7._0_4_;
  auVar243._4_4_ = fVar222 * auVar7._4_4_;
  auVar243._8_4_ = fVar132 * auVar7._8_4_;
  auVar243._12_4_ = fVar143 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar10 = vfmadd231ps_fma(auVar243,(undefined1  [16])aVar1,auVar7);
  local_2e8 = vsubps_avx(local_488,auVar11);
  auVar7 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar255._0_4_ = fVar63 * auVar7._0_4_;
  auVar255._4_4_ = fVar222 * auVar7._4_4_;
  auVar255._8_4_ = fVar132 * auVar7._8_4_;
  auVar255._12_4_ = fVar143 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar12 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar1,auVar7);
  local_2f8 = vsubps_avx(_local_478,auVar11);
  auVar7 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar148._0_4_ = fVar63 * auVar7._0_4_;
  auVar148._4_4_ = fVar222 * auVar7._4_4_;
  auVar148._8_4_ = fVar132 * auVar7._8_4_;
  auVar148._12_4_ = fVar143 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar65 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar1,auVar7);
  local_4b8._0_4_ = (fVar61 + auVar159._0_4_) * 0.33333334 + (float)local_478._0_4_;
  local_4b8._4_4_ = (fVar86 + auVar159._4_4_) * 0.33333334 + (float)local_478._4_4_;
  fStack_4b0 = (fVar121 + auVar159._8_4_) * 0.33333334 + fStack_470;
  fStack_4ac = (fVar87 + auVar159._12_4_) * 0.33333334 + fStack_46c;
  local_308 = vsubps_avx(_local_4b8,auVar11);
  auVar7 = vshufps_avx(local_308,local_308,0xaa);
  auVar196._0_4_ = auVar7._0_4_ * fVar63;
  auVar196._4_4_ = auVar7._4_4_ * fVar222;
  auVar196._8_4_ = auVar7._8_4_ * fVar132;
  auVar196._12_4_ = auVar7._12_4_ * fVar143;
  auVar7 = vshufps_avx(local_308,local_308,0x55);
  auVar64 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar1,auVar7);
  auVar210._0_4_ = (fVar84 + auVar94._0_4_) * 0.33333334;
  auVar210._4_4_ = (fVar88 + auVar94._4_4_) * 0.33333334;
  auVar210._8_4_ = (fVar85 + auVar94._8_4_) * 0.33333334;
  auVar210._12_4_ = (fVar144 + auVar94._12_4_) * 0.33333334;
  auVar43._4_4_ = fVar173;
  auVar43._0_4_ = fVar158;
  auVar43._8_4_ = fVar174;
  auVar43._12_4_ = fVar175;
  _local_4c8 = vsubps_avx(auVar43,auVar210);
  local_318 = vsubps_avx(_local_4c8,auVar11);
  auVar7 = vshufps_avx(local_318,local_318,0xaa);
  auVar211._0_4_ = auVar7._0_4_ * fVar63;
  auVar211._4_4_ = auVar7._4_4_ * fVar222;
  auVar211._8_4_ = auVar7._8_4_ * fVar132;
  auVar211._12_4_ = auVar7._12_4_ * fVar143;
  auVar7 = vshufps_avx(local_318,local_318,0x55);
  auVar109 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar1,auVar7);
  local_328 = vsubps_avx(auVar43,auVar11);
  auVar7 = vshufps_avx(local_328,local_328,0xaa);
  auVar67._0_4_ = fVar63 * auVar7._0_4_;
  auVar67._4_4_ = fVar222 * auVar7._4_4_;
  auVar67._8_4_ = fVar132 * auVar7._8_4_;
  auVar67._12_4_ = fVar143 * auVar7._12_4_;
  auVar7 = vshufps_avx(local_328,local_328,0x55);
  auVar7 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar1,auVar7);
  auVar160._4_4_ = local_448._0_4_;
  auVar160._0_4_ = local_448._0_4_;
  auVar160._8_4_ = local_448._0_4_;
  auVar160._12_4_ = local_448._0_4_;
  aVar1 = (pLVar59->vx).field_0;
  auVar92 = vfmadd231ps_fma(auVar277,(undefined1  [16])aVar1,auVar160);
  auVar161._4_4_ = local_458._0_4_;
  auVar161._0_4_ = local_458._0_4_;
  auVar161._8_4_ = local_458._0_4_;
  auVar161._12_4_ = local_458._0_4_;
  auVar245 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar161);
  uVar62 = local_2d8._0_4_;
  auVar162._4_4_ = uVar62;
  auVar162._0_4_ = uVar62;
  auVar162._8_4_ = uVar62;
  auVar162._12_4_ = uVar62;
  auVar73 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar162);
  uVar62 = local_2e8._0_4_;
  auVar163._4_4_ = uVar62;
  auVar163._0_4_ = uVar62;
  auVar163._8_4_ = uVar62;
  auVar163._12_4_ = uVar62;
  auVar12 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar1,auVar163);
  uVar62 = local_2f8._0_4_;
  auVar164._4_4_ = uVar62;
  auVar164._0_4_ = uVar62;
  auVar164._8_4_ = uVar62;
  auVar164._12_4_ = uVar62;
  auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar164);
  uVar62 = local_308._0_4_;
  auVar165._4_4_ = uVar62;
  auVar165._0_4_ = uVar62;
  auVar165._8_4_ = uVar62;
  auVar165._12_4_ = uVar62;
  auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar165);
  uVar62 = local_318._0_4_;
  auVar166._4_4_ = uVar62;
  auVar166._0_4_ = uVar62;
  auVar166._8_4_ = uVar62;
  auVar166._12_4_ = uVar62;
  auVar109 = vfmadd231ps_fma(auVar109,(undefined1  [16])aVar1,auVar166);
  uVar62 = local_328._0_4_;
  auVar167._4_4_ = uVar62;
  auVar167._0_4_ = uVar62;
  auVar167._8_4_ = uVar62;
  auVar167._12_4_ = uVar62;
  auVar122 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar1,auVar167);
  auVar10 = vmovlhps_avx(auVar92,auVar65);
  auVar11 = vmovlhps_avx(auVar245,auVar64);
  local_3f8 = vmovlhps_avx(auVar73,auVar109);
  _local_2c8 = vmovlhps_avx(auVar12,auVar122);
  auVar7 = vminps_avx(auVar10,auVar11);
  auVar8 = vminps_avx(local_3f8,_local_2c8);
  auVar277 = vminps_avx(auVar7,auVar8);
  auVar7 = vmaxps_avx(auVar10,auVar11);
  auVar8 = vmaxps_avx(local_3f8,_local_2c8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vshufpd_avx(auVar277,auVar277,3);
  auVar277 = vminps_avx(auVar277,auVar8);
  auVar8 = vshufpd_avx(auVar7,auVar7,3);
  auVar8 = vmaxps_avx(auVar7,auVar8);
  auVar7 = vandps_avx(auVar242,auVar277);
  auVar8 = vandps_avx(auVar242,auVar8);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar8 = vmovshdup_avx(auVar7);
  auVar7 = vmaxss_avx(auVar8,auVar7);
  fVar84 = auVar7._0_4_ * 9.536743e-07;
  auVar179._8_8_ = auVar92._0_8_;
  auVar179._0_8_ = auVar92._0_8_;
  auVar226._8_8_ = auVar245._0_8_;
  auVar226._0_8_ = auVar245._0_8_;
  auVar244._0_8_ = auVar73._0_8_;
  auVar244._8_8_ = auVar244._0_8_;
  auVar256._0_8_ = auVar12._0_8_;
  auVar256._8_8_ = auVar256._0_8_;
  local_248 = -fVar84;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  fStack_238 = local_248;
  fStack_234 = local_248;
  fStack_230 = local_248;
  fStack_22c = local_248;
  local_358 = uVar54;
  uStack_354 = uVar54;
  uStack_350 = uVar54;
  uStack_34c = uVar54;
  uStack_364 = local_368;
  uStack_360 = local_368;
  uStack_35c = local_368;
  bVar49 = false;
  uVar51 = 0;
  fVar61 = *(float *)(ray + k * 4 + 0x30);
  local_298 = vsubps_avx(auVar11,auVar10);
  local_2a8 = vsubps_avx(local_3f8,auVar11);
  local_2b8 = vsubps_avx(_local_2c8,local_3f8);
  local_378 = vsubps_avx(_local_478,local_468);
  local_388 = vsubps_avx(_local_4b8,local_498);
  local_398 = vsubps_avx(_local_4c8,local_4a8);
  auVar44._4_4_ = fVar173;
  auVar44._0_4_ = fVar158;
  auVar44._8_4_ = fVar174;
  auVar44._12_4_ = fVar175;
  _local_3a8 = vsubps_avx(auVar44,local_488);
  auVar68 = ZEXT816(0x3f80000000000000);
  local_228 = fVar84;
  fStack_224 = fVar84;
  fStack_220 = fVar84;
  fStack_21c = fVar84;
  fStack_218 = fVar84;
  fStack_214 = fVar84;
  fStack_210 = fVar84;
  fStack_20c = fVar84;
  local_338 = auVar68;
LAB_015fccd2:
  auVar7 = vshufps_avx(auVar68,auVar68,0x50);
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = 0x3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar280._16_4_ = 0x3f800000;
  auVar280._0_16_ = auVar276;
  auVar280._20_4_ = 0x3f800000;
  auVar280._24_4_ = 0x3f800000;
  auVar280._28_4_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar276,auVar7);
  fVar86 = auVar7._0_4_;
  fVar132 = auVar65._0_4_;
  auVar69._0_4_ = fVar132 * fVar86;
  fVar88 = auVar7._4_4_;
  fVar143 = auVar65._4_4_;
  auVar69._4_4_ = fVar143 * fVar88;
  fVar121 = auVar7._8_4_;
  auVar69._8_4_ = fVar132 * fVar121;
  fVar85 = auVar7._12_4_;
  auVar69._12_4_ = fVar143 * fVar85;
  fVar253 = auVar64._0_4_;
  auVar168._0_4_ = fVar253 * fVar86;
  fVar263 = auVar64._4_4_;
  auVar168._4_4_ = fVar263 * fVar88;
  auVar168._8_4_ = fVar253 * fVar121;
  auVar168._12_4_ = fVar263 * fVar85;
  fVar191 = auVar109._0_4_;
  auVar136._0_4_ = fVar191 * fVar86;
  fVar204 = auVar109._4_4_;
  auVar136._4_4_ = fVar204 * fVar88;
  auVar136._8_4_ = fVar191 * fVar121;
  auVar136._12_4_ = fVar204 * fVar85;
  fVar205 = auVar122._0_4_;
  auVar111._0_4_ = fVar205 * fVar86;
  fVar221 = auVar122._4_4_;
  auVar111._4_4_ = fVar221 * fVar88;
  auVar111._8_4_ = fVar205 * fVar121;
  auVar111._12_4_ = fVar221 * fVar85;
  auVar92 = vfmadd231ps_fma(auVar69,auVar8,auVar179);
  auVar245 = vfmadd231ps_fma(auVar168,auVar8,auVar226);
  auVar73 = vfmadd231ps_fma(auVar136,auVar8,auVar244);
  auVar134 = vfmadd231ps_fma(auVar111,auVar256,auVar8);
  auVar7 = vmovshdup_avx(local_338);
  fVar86 = local_338._0_4_;
  fStack_e0 = (auVar7._0_4_ - fVar86) * 0.04761905;
  auVar219._4_4_ = fVar86;
  auVar219._0_4_ = fVar86;
  auVar219._8_4_ = fVar86;
  auVar219._12_4_ = fVar86;
  auVar219._16_4_ = fVar86;
  auVar219._20_4_ = fVar86;
  auVar219._24_4_ = fVar86;
  auVar219._28_4_ = fVar86;
  auVar105._0_8_ = auVar7._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  auVar81 = vsubps_avx(auVar105,auVar219);
  uVar62 = auVar92._0_4_;
  auVar272._4_4_ = uVar62;
  auVar272._0_4_ = uVar62;
  auVar272._8_4_ = uVar62;
  auVar272._12_4_ = uVar62;
  auVar272._16_4_ = uVar62;
  auVar272._20_4_ = uVar62;
  auVar272._24_4_ = uVar62;
  auVar272._28_4_ = uVar62;
  auVar7 = vmovshdup_avx(auVar92);
  uVar90 = auVar7._0_8_;
  auVar262._8_8_ = uVar90;
  auVar262._0_8_ = uVar90;
  auVar262._16_8_ = uVar90;
  auVar262._24_8_ = uVar90;
  fVar264 = auVar245._0_4_;
  auVar250._4_4_ = fVar264;
  auVar250._0_4_ = fVar264;
  auVar250._8_4_ = fVar264;
  auVar250._12_4_ = fVar264;
  auVar250._16_4_ = fVar264;
  auVar250._20_4_ = fVar264;
  auVar250._24_4_ = fVar264;
  auVar250._28_4_ = fVar264;
  auVar8 = vmovshdup_avx(auVar245);
  auVar106._0_8_ = auVar8._0_8_;
  auVar106._8_8_ = auVar106._0_8_;
  auVar106._16_8_ = auVar106._0_8_;
  auVar106._24_8_ = auVar106._0_8_;
  fVar222 = auVar73._0_4_;
  auVar183._4_4_ = fVar222;
  auVar183._0_4_ = fVar222;
  auVar183._8_4_ = fVar222;
  auVar183._12_4_ = fVar222;
  auVar183._16_4_ = fVar222;
  auVar183._20_4_ = fVar222;
  auVar183._24_4_ = fVar222;
  auVar183._28_4_ = fVar222;
  auVar277 = vmovshdup_avx(auVar73);
  auVar202._0_8_ = auVar277._0_8_;
  auVar202._8_8_ = auVar202._0_8_;
  auVar202._16_8_ = auVar202._0_8_;
  auVar202._24_8_ = auVar202._0_8_;
  fVar63 = auVar134._0_4_;
  auVar12 = vmovshdup_avx(auVar134);
  auVar237 = vfmadd132ps_fma(auVar81,auVar219,_DAT_01faff20);
  auVar81 = vsubps_avx(auVar280,ZEXT1632(auVar237));
  fVar86 = auVar237._0_4_;
  fVar88 = auVar237._4_4_;
  auVar13._4_4_ = fVar264 * fVar88;
  auVar13._0_4_ = fVar264 * fVar86;
  fVar121 = auVar237._8_4_;
  auVar13._8_4_ = fVar264 * fVar121;
  fVar85 = auVar237._12_4_;
  auVar13._12_4_ = fVar264 * fVar85;
  auVar13._16_4_ = fVar264 * 0.0;
  auVar13._20_4_ = fVar264 * 0.0;
  auVar13._24_4_ = fVar264 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar237 = vfmadd231ps_fma(auVar13,auVar81,auVar272);
  fVar87 = auVar8._0_4_;
  fVar144 = auVar8._4_4_;
  auVar14._4_4_ = fVar144 * fVar88;
  auVar14._0_4_ = fVar87 * fVar86;
  auVar14._8_4_ = fVar87 * fVar121;
  auVar14._12_4_ = fVar144 * fVar85;
  auVar14._16_4_ = fVar87 * 0.0;
  auVar14._20_4_ = fVar144 * 0.0;
  auVar14._24_4_ = fVar87 * 0.0;
  auVar14._28_4_ = uVar62;
  auVar91 = vfmadd231ps_fma(auVar14,auVar81,auVar262);
  auVar15._4_4_ = fVar222 * fVar88;
  auVar15._0_4_ = fVar222 * fVar86;
  auVar15._8_4_ = fVar222 * fVar121;
  auVar15._12_4_ = fVar222 * fVar85;
  auVar15._16_4_ = fVar222 * 0.0;
  auVar15._20_4_ = fVar222 * 0.0;
  auVar15._24_4_ = fVar222 * 0.0;
  auVar15._28_4_ = auVar7._4_4_;
  auVar133 = vfmadd231ps_fma(auVar15,auVar81,auVar250);
  fVar87 = auVar277._0_4_;
  fVar144 = auVar277._4_4_;
  auVar9._4_4_ = fVar144 * fVar88;
  auVar9._0_4_ = fVar87 * fVar86;
  auVar9._8_4_ = fVar87 * fVar121;
  auVar9._12_4_ = fVar144 * fVar85;
  auVar9._16_4_ = fVar87 * 0.0;
  auVar9._20_4_ = fVar144 * 0.0;
  auVar9._24_4_ = fVar87 * 0.0;
  auVar9._28_4_ = fVar264;
  auVar124 = vfmadd231ps_fma(auVar9,auVar81,auVar106);
  auVar7 = vshufps_avx(auVar92,auVar92,0xaa);
  local_558._8_8_ = auVar7._0_8_;
  local_558._0_8_ = local_558._8_8_;
  local_558._16_8_ = local_558._8_8_;
  local_558._24_8_ = local_558._8_8_;
  auVar8 = vshufps_avx(auVar92,auVar92,0xff);
  uStack_640 = auVar8._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar16._4_4_ = fVar63 * fVar88;
  auVar16._0_4_ = fVar63 * fVar86;
  auVar16._8_4_ = fVar63 * fVar121;
  auVar16._12_4_ = fVar63 * fVar85;
  auVar16._16_4_ = fVar63 * 0.0;
  auVar16._20_4_ = fVar63 * 0.0;
  auVar16._24_4_ = fVar63 * 0.0;
  auVar16._28_4_ = fVar63;
  auVar92 = vfmadd231ps_fma(auVar16,auVar81,auVar183);
  auVar8 = vshufps_avx(auVar245,auVar245,0xaa);
  auVar184._0_8_ = auVar8._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar184._16_8_ = auVar184._0_8_;
  auVar184._24_8_ = auVar184._0_8_;
  auVar277 = vshufps_avx(auVar245,auVar245,0xff);
  local_4e8._8_8_ = auVar277._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar87 = auVar12._0_4_;
  fVar144 = auVar12._4_4_;
  auVar17._4_4_ = fVar144 * fVar88;
  auVar17._0_4_ = fVar87 * fVar86;
  auVar17._8_4_ = fVar87 * fVar121;
  auVar17._12_4_ = fVar144 * fVar85;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar144 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = auVar7._4_4_;
  auVar145 = vfmadd231ps_fma(auVar17,auVar81,auVar202);
  auVar252._28_4_ = fVar144;
  auVar252._0_28_ =
       ZEXT1628(CONCAT412(auVar133._12_4_ * fVar85,
                          CONCAT48(auVar133._8_4_ * fVar121,
                                   CONCAT44(auVar133._4_4_ * fVar88,auVar133._0_4_ * fVar86))));
  auVar237 = vfmadd231ps_fma(auVar252,auVar81,ZEXT1632(auVar237));
  fVar87 = auVar277._4_4_;
  auVar19._28_4_ = fVar87;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar124._12_4_ * fVar85,
                          CONCAT48(auVar124._8_4_ * fVar121,
                                   CONCAT44(auVar124._4_4_ * fVar88,auVar124._0_4_ * fVar86))));
  auVar91 = vfmadd231ps_fma(auVar19,auVar81,ZEXT1632(auVar91));
  auVar7 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar90 = auVar7._0_8_;
  auVar172._8_8_ = uVar90;
  auVar172._0_8_ = uVar90;
  auVar172._16_8_ = uVar90;
  auVar172._24_8_ = uVar90;
  auVar12 = vshufps_avx(auVar73,auVar73,0xff);
  uVar90 = auVar12._0_8_;
  auVar281._8_8_ = uVar90;
  auVar281._0_8_ = uVar90;
  auVar281._16_8_ = uVar90;
  auVar281._24_8_ = uVar90;
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar85,
                                               CONCAT48(auVar92._8_4_ * fVar121,
                                                        CONCAT44(auVar92._4_4_ * fVar88,
                                                                 auVar92._0_4_ * fVar86)))),auVar81,
                            ZEXT1632(auVar133));
  auVar92 = vshufps_avx(auVar134,auVar134,0xaa);
  auVar245 = vshufps_avx(auVar134,auVar134,0xff);
  auVar134 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar145._12_4_,
                                                CONCAT48(fVar121 * auVar145._8_4_,
                                                         CONCAT44(fVar88 * auVar145._4_4_,
                                                                  fVar86 * auVar145._0_4_)))),
                             auVar81,ZEXT1632(auVar124));
  auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar73._12_4_,
                                                CONCAT48(fVar121 * auVar73._8_4_,
                                                         CONCAT44(fVar88 * auVar73._4_4_,
                                                                  fVar86 * auVar73._0_4_)))),auVar81
                             ,ZEXT1632(auVar237));
  auVar13 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar237));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar134._12_4_,
                                               CONCAT48(fVar121 * auVar134._8_4_,
                                                        CONCAT44(fVar88 * auVar134._4_4_,
                                                                 fVar86 * auVar134._0_4_)))),auVar81
                            ,ZEXT1632(auVar91));
  auVar14 = vsubps_avx(ZEXT1632(auVar134),ZEXT1632(auVar91));
  fStack_41c = auVar14._28_4_;
  auVar251._0_4_ = fStack_e0 * auVar13._0_4_ * 3.0;
  auVar251._4_4_ = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar251._8_4_ = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar251._12_4_ = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar251._16_4_ = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar251._20_4_ = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar251._24_4_ = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar251._28_4_ = 0;
  local_438._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  local_438._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  fStack_430 = fStack_e0 * auVar14._8_4_ * 3.0;
  fStack_42c = fStack_e0 * auVar14._12_4_ * 3.0;
  fStack_428 = fStack_e0 * auVar14._16_4_ * 3.0;
  fStack_424 = fStack_e0 * auVar14._20_4_ * 3.0;
  fStack_420 = fStack_e0 * auVar14._24_4_ * 3.0;
  fVar144 = auVar8._0_4_;
  fVar63 = auVar8._4_4_;
  auVar20._4_4_ = fVar63 * fVar88;
  auVar20._0_4_ = fVar144 * fVar86;
  auVar20._8_4_ = fVar144 * fVar121;
  auVar20._12_4_ = fVar63 * fVar85;
  auVar20._16_4_ = fVar144 * 0.0;
  auVar20._20_4_ = fVar63 * 0.0;
  auVar20._24_4_ = fVar144 * 0.0;
  auVar20._28_4_ = fStack_41c;
  auVar8 = vfmadd231ps_fma(auVar20,auVar81,local_558);
  fVar144 = auVar277._0_4_;
  auVar21._4_4_ = fVar87 * fVar88;
  auVar21._0_4_ = fVar144 * fVar86;
  auVar21._8_4_ = fVar144 * fVar121;
  auVar21._12_4_ = fVar87 * fVar85;
  auVar21._16_4_ = fVar144 * 0.0;
  auVar21._20_4_ = fVar87 * 0.0;
  auVar21._24_4_ = fVar144 * 0.0;
  auVar21._28_4_ = 0;
  auVar277 = vfmadd231ps_fma(auVar21,auVar81,_local_648);
  fVar87 = auVar7._0_4_;
  fVar144 = auVar7._4_4_;
  auVar22._4_4_ = fVar144 * fVar88;
  auVar22._0_4_ = fVar87 * fVar86;
  auVar22._8_4_ = fVar87 * fVar121;
  auVar22._12_4_ = fVar144 * fVar85;
  auVar22._16_4_ = fVar87 * 0.0;
  auVar22._20_4_ = fVar144 * 0.0;
  auVar22._24_4_ = fVar87 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar7 = vfmadd231ps_fma(auVar22,auVar81,auVar184);
  fVar87 = auVar12._0_4_;
  fVar222 = auVar12._4_4_;
  auVar23._4_4_ = fVar222 * fVar88;
  auVar23._0_4_ = fVar87 * fVar86;
  auVar23._8_4_ = fVar87 * fVar121;
  auVar23._12_4_ = fVar222 * fVar85;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar222 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = fVar63;
  auVar12 = vfmadd231ps_fma(auVar23,auVar81,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar133));
  fVar87 = auVar92._0_4_;
  fVar144 = auVar92._4_4_;
  auVar24._4_4_ = fVar144 * fVar88;
  auVar24._0_4_ = fVar87 * fVar86;
  auVar24._8_4_ = fVar87 * fVar121;
  auVar24._12_4_ = fVar144 * fVar85;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar144;
  auVar92 = vfmadd231ps_fma(auVar24,auVar81,auVar172);
  auVar16 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar73));
  fVar87 = auVar245._0_4_;
  fVar144 = auVar245._4_4_;
  auVar25._4_4_ = fVar144 * fVar88;
  auVar25._0_4_ = fVar87 * fVar86;
  auVar25._8_4_ = fVar87 * fVar121;
  auVar25._12_4_ = fVar144 * fVar85;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar144 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar144;
  auVar245 = vfmadd231ps_fma(auVar25,auVar81,auVar281);
  auVar26._28_4_ = fVar222;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar7._12_4_ * fVar85,
                          CONCAT48(auVar7._8_4_ * fVar121,
                                   CONCAT44(auVar7._4_4_ * fVar88,auVar7._0_4_ * fVar86))));
  auVar8 = vfmadd231ps_fma(auVar26,auVar81,ZEXT1632(auVar8));
  auVar277 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar12._12_4_,
                                                CONCAT48(fVar121 * auVar12._8_4_,
                                                         CONCAT44(fVar88 * auVar12._4_4_,
                                                                  fVar86 * auVar12._0_4_)))),auVar81
                             ,ZEXT1632(auVar277));
  auVar107._0_4_ = auVar133._0_4_ + auVar251._0_4_;
  auVar107._4_4_ = auVar133._4_4_ + auVar251._4_4_;
  auVar107._8_4_ = auVar133._8_4_ + auVar251._8_4_;
  auVar107._12_4_ = auVar133._12_4_ + auVar251._12_4_;
  auVar107._16_4_ = auVar251._16_4_ + 0.0;
  auVar107._20_4_ = auVar251._20_4_ + 0.0;
  auVar107._24_4_ = auVar251._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar7 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar85,
                                              CONCAT48(auVar92._8_4_ * fVar121,
                                                       CONCAT44(auVar92._4_4_ * fVar88,
                                                                auVar92._0_4_ * fVar86)))),auVar81,
                           ZEXT1632(auVar7));
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar245._12_4_ * fVar85,
                                               CONCAT48(auVar245._8_4_ * fVar121,
                                                        CONCAT44(auVar245._4_4_ * fVar88,
                                                                 auVar245._0_4_ * fVar86)))),auVar81
                            ,ZEXT1632(auVar12));
  auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar7._12_4_,
                                               CONCAT48(fVar121 * auVar7._8_4_,
                                                        CONCAT44(fVar88 * auVar7._4_4_,
                                                                 fVar86 * auVar7._0_4_)))),auVar81,
                            ZEXT1632(auVar8));
  auVar245 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar85,
                                                CONCAT48(auVar12._8_4_ * fVar121,
                                                         CONCAT44(auVar12._4_4_ * fVar88,
                                                                  auVar12._0_4_ * fVar86)))),
                             ZEXT1632(auVar277),auVar81);
  auVar81 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar13 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar277));
  auVar273._0_4_ = fStack_e0 * auVar81._0_4_ * 3.0;
  auVar273._4_4_ = fStack_e0 * auVar81._4_4_ * 3.0;
  auVar273._8_4_ = fStack_e0 * auVar81._8_4_ * 3.0;
  auVar273._12_4_ = fStack_e0 * auVar81._12_4_ * 3.0;
  auVar273._16_4_ = fStack_e0 * auVar81._16_4_ * 3.0;
  auVar273._20_4_ = fStack_e0 * auVar81._20_4_ * 3.0;
  auVar273._24_4_ = fStack_e0 * auVar81._24_4_ * 3.0;
  auVar273._28_4_ = 0;
  local_f8 = fStack_e0 * auVar13._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_f4;
  auVar27._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_e0;
  auVar27._28_4_ = 0x40400000;
  _local_418 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar92));
  local_268 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar245));
  auVar81 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar133));
  auVar13 = vsubps_avx(ZEXT1632(auVar245),ZEXT1632(auVar73));
  auVar14 = vsubps_avx(_local_418,local_4e8);
  fVar264 = auVar81._0_4_ + auVar14._0_4_;
  fVar265 = auVar81._4_4_ + auVar14._4_4_;
  fVar186 = auVar81._8_4_ + auVar14._8_4_;
  fVar187 = auVar81._12_4_ + auVar14._12_4_;
  fVar188 = auVar81._16_4_ + auVar14._16_4_;
  fVar189 = auVar81._20_4_ + auVar14._20_4_;
  fVar190 = auVar81._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(local_268,auVar16);
  auVar82._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar82._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar82._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar82._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar82._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar82._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar82._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar82._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_98 = ZEXT1632(auVar73);
  fVar86 = auVar73._0_4_;
  local_118 = (float)local_438._0_4_ + fVar86;
  fVar88 = auVar73._4_4_;
  fStack_114 = (float)local_438._4_4_ + fVar88;
  fVar121 = auVar73._8_4_;
  fStack_110 = fStack_430 + fVar121;
  fVar85 = auVar73._12_4_;
  fStack_10c = fStack_42c + fVar85;
  fStack_108 = fStack_428 + 0.0;
  fStack_104 = fStack_424 + 0.0;
  fStack_100 = fStack_420 + 0.0;
  local_288 = ZEXT1632(auVar133);
  auVar13 = vsubps_avx(local_288,auVar251);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar13 = vsubps_avx(local_98,_local_438);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar13);
  local_b8._0_4_ = auVar92._0_4_ + auVar273._0_4_;
  local_b8._4_4_ = auVar92._4_4_ + auVar273._4_4_;
  local_b8._8_4_ = auVar92._8_4_ + auVar273._8_4_;
  local_b8._12_4_ = auVar92._12_4_ + auVar273._12_4_;
  local_b8._16_4_ = auVar273._16_4_ + 0.0;
  local_b8._20_4_ = auVar273._20_4_ + 0.0;
  local_b8._24_4_ = auVar273._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar220 = ZEXT3264(local_b8);
  auVar252 = ZEXT1632(auVar92);
  auVar13 = vsubps_avx(auVar252,auVar273);
  auVar17 = vpermps_avx2(_DAT_01fec480,auVar13);
  fVar87 = auVar245._0_4_;
  local_f8 = fVar87 + local_f8;
  fVar144 = auVar245._4_4_;
  fStack_f4 = fVar144 + fStack_f4;
  fVar63 = auVar245._8_4_;
  fStack_f0 = fVar63 + fStack_f0;
  fVar222 = auVar245._12_4_;
  fStack_ec = fVar222 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar245),auVar27);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar13);
  auVar28._4_4_ = fVar88 * fVar265;
  auVar28._0_4_ = fVar86 * fVar264;
  auVar28._8_4_ = fVar121 * fVar186;
  auVar28._12_4_ = fVar85 * fVar187;
  auVar28._16_4_ = fVar188 * 0.0;
  auVar28._20_4_ = fVar189 * 0.0;
  auVar28._24_4_ = fVar190 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar7 = vfnmadd231ps_fma(auVar28,local_288,auVar82);
  fStack_fc = fStack_41c + 0.0;
  auVar29._4_4_ = fStack_114 * fVar265;
  auVar29._0_4_ = local_118 * fVar264;
  auVar29._8_4_ = fStack_110 * fVar186;
  auVar29._12_4_ = fStack_10c * fVar187;
  auVar29._16_4_ = fStack_108 * fVar188;
  auVar29._20_4_ = fStack_104 * fVar189;
  auVar29._24_4_ = fStack_100 * fVar190;
  auVar29._28_4_ = 0;
  auVar8 = vfnmadd231ps_fma(auVar29,auVar82,auVar107);
  auVar30._4_4_ = local_138._4_4_ * fVar265;
  auVar30._0_4_ = local_138._0_4_ * fVar264;
  auVar30._8_4_ = local_138._8_4_ * fVar186;
  auVar30._12_4_ = local_138._12_4_ * fVar187;
  auVar30._16_4_ = local_138._16_4_ * fVar188;
  auVar30._20_4_ = local_138._20_4_ * fVar189;
  auVar30._24_4_ = local_138._24_4_ * fVar190;
  auVar30._28_4_ = fStack_41c + 0.0;
  auVar277 = vfnmadd231ps_fma(auVar30,local_78,auVar82);
  local_648._0_4_ = auVar16._0_4_;
  local_648._4_4_ = auVar16._4_4_;
  uStack_640._0_4_ = auVar16._8_4_;
  uStack_640._4_4_ = auVar16._12_4_;
  uStack_638._0_4_ = auVar16._16_4_;
  uStack_638._4_4_ = auVar16._20_4_;
  uStack_630._0_4_ = auVar16._24_4_;
  uStack_630._4_4_ = auVar16._28_4_;
  auVar31._4_4_ = (float)local_648._4_4_ * fVar265;
  auVar31._0_4_ = (float)local_648._0_4_ * fVar264;
  auVar31._8_4_ = (float)uStack_640 * fVar186;
  auVar31._12_4_ = uStack_640._4_4_ * fVar187;
  auVar31._16_4_ = (float)uStack_638 * fVar188;
  auVar31._20_4_ = uStack_638._4_4_ * fVar189;
  auVar31._24_4_ = (float)uStack_630 * fVar190;
  auVar31._28_4_ = uStack_630._4_4_;
  auVar12 = vfnmadd231ps_fma(auVar31,local_4e8,auVar82);
  auVar203._0_4_ = fVar87 * fVar264;
  auVar203._4_4_ = fVar144 * fVar265;
  auVar203._8_4_ = fVar63 * fVar186;
  auVar203._12_4_ = fVar222 * fVar187;
  auVar203._16_4_ = fVar188 * 0.0;
  auVar203._20_4_ = fVar189 * 0.0;
  auVar203._24_4_ = fVar190 * 0.0;
  auVar203._28_4_ = 0;
  auVar92 = vfnmadd231ps_fma(auVar203,auVar252,auVar82);
  uStack_dc = 0x40400000;
  auVar32._4_4_ = fStack_f4 * fVar265;
  auVar32._0_4_ = local_f8 * fVar264;
  auVar32._8_4_ = fStack_f0 * fVar186;
  auVar32._12_4_ = fStack_ec * fVar187;
  auVar32._16_4_ = fStack_e8 * fVar188;
  auVar32._20_4_ = fStack_e4 * fVar189;
  auVar32._24_4_ = fStack_e0 * fVar190;
  auVar32._28_4_ = local_4e8._28_4_;
  auVar73 = vfnmadd231ps_fma(auVar32,local_b8,auVar82);
  auVar33._4_4_ = local_d8._4_4_ * fVar265;
  auVar33._0_4_ = local_d8._0_4_ * fVar264;
  auVar33._8_4_ = local_d8._8_4_ * fVar186;
  auVar33._12_4_ = local_d8._12_4_ * fVar187;
  auVar33._16_4_ = local_d8._16_4_ * fVar188;
  auVar33._20_4_ = local_d8._20_4_ * fVar189;
  auVar33._24_4_ = local_d8._24_4_ * fVar190;
  auVar33._28_4_ = local_d8._28_4_;
  auVar134 = vfnmadd231ps_fma(auVar33,auVar17,auVar82);
  auVar34._4_4_ = local_268._4_4_ * fVar265;
  auVar34._0_4_ = local_268._0_4_ * fVar264;
  auVar34._8_4_ = local_268._8_4_ * fVar186;
  auVar34._12_4_ = local_268._12_4_ * fVar187;
  auVar34._16_4_ = local_268._16_4_ * fVar188;
  auVar34._20_4_ = local_268._20_4_ * fVar189;
  auVar34._24_4_ = local_268._24_4_ * fVar190;
  auVar34._28_4_ = auVar81._28_4_ + auVar14._28_4_;
  auVar237 = vfnmadd231ps_fma(auVar34,_local_418,auVar82);
  auVar13 = vminps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar81 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
  auVar14 = vminps_avx(ZEXT1632(auVar277),ZEXT1632(auVar12));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar277),ZEXT1632(auVar12));
  auVar81 = vmaxps_avx(auVar81,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar13 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar73));
  auVar9 = vminps_avx(ZEXT1632(auVar134),ZEXT1632(auVar237));
  auVar15 = vminps_avx(auVar15,auVar9);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar134),ZEXT1632(auVar237));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar81,auVar13);
  auVar47._4_4_ = fStack_224;
  auVar47._0_4_ = local_228;
  auVar47._8_4_ = fStack_220;
  auVar47._12_4_ = fStack_21c;
  auVar47._16_4_ = fStack_218;
  auVar47._20_4_ = fStack_214;
  auVar47._24_4_ = fStack_210;
  auVar47._28_4_ = fStack_20c;
  auVar81 = vcmpps_avx(auVar15,auVar47,2);
  auVar45._4_4_ = fStack_244;
  auVar45._0_4_ = local_248;
  auVar45._8_4_ = fStack_240;
  auVar45._12_4_ = fStack_23c;
  auVar45._16_4_ = fStack_238;
  auVar45._20_4_ = fStack_234;
  auVar45._24_4_ = fStack_230;
  auVar45._28_4_ = fStack_22c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar81 = vandps_avx(auVar13,auVar81);
  auVar13 = local_158 & auVar81;
  _local_438 = auVar17;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_4e8,local_288);
    auVar14 = vsubps_avx(_local_418,auVar252);
    fVar265 = auVar13._0_4_ + auVar14._0_4_;
    fVar186 = auVar13._4_4_ + auVar14._4_4_;
    fVar187 = auVar13._8_4_ + auVar14._8_4_;
    fVar188 = auVar13._12_4_ + auVar14._12_4_;
    fVar189 = auVar13._16_4_ + auVar14._16_4_;
    fVar190 = auVar13._20_4_ + auVar14._20_4_;
    fVar89 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(auVar16,local_98);
    auVar9 = vsubps_avx(local_268,ZEXT1632(auVar245));
    auVar108._0_4_ = auVar15._0_4_ + auVar9._0_4_;
    auVar108._4_4_ = auVar15._4_4_ + auVar9._4_4_;
    auVar108._8_4_ = auVar15._8_4_ + auVar9._8_4_;
    auVar108._12_4_ = auVar15._12_4_ + auVar9._12_4_;
    auVar108._16_4_ = auVar15._16_4_ + auVar9._16_4_;
    auVar108._20_4_ = auVar15._20_4_ + auVar9._20_4_;
    auVar108._24_4_ = auVar15._24_4_ + auVar9._24_4_;
    fVar264 = auVar9._28_4_;
    auVar108._28_4_ = auVar15._28_4_ + fVar264;
    auVar35._4_4_ = fVar88 * fVar186;
    auVar35._0_4_ = fVar86 * fVar265;
    auVar35._8_4_ = fVar121 * fVar187;
    auVar35._12_4_ = fVar85 * fVar188;
    auVar35._16_4_ = fVar189 * 0.0;
    auVar35._20_4_ = fVar190 * 0.0;
    auVar35._24_4_ = fVar89 * 0.0;
    auVar35._28_4_ = local_418._28_4_;
    auVar92 = vfnmadd231ps_fma(auVar35,auVar108,local_288);
    auVar36._4_4_ = fVar186 * fStack_114;
    auVar36._0_4_ = fVar265 * local_118;
    auVar36._8_4_ = fVar187 * fStack_110;
    auVar36._12_4_ = fVar188 * fStack_10c;
    auVar36._16_4_ = fVar189 * fStack_108;
    auVar36._20_4_ = fVar190 * fStack_104;
    auVar36._24_4_ = fVar89 * fStack_100;
    auVar36._28_4_ = 0;
    auVar7 = vfnmadd213ps_fma(auVar107,auVar108,auVar36);
    auVar37._4_4_ = fVar186 * local_138._4_4_;
    auVar37._0_4_ = fVar265 * local_138._0_4_;
    auVar37._8_4_ = fVar187 * local_138._8_4_;
    auVar37._12_4_ = fVar188 * local_138._12_4_;
    auVar37._16_4_ = fVar189 * local_138._16_4_;
    auVar37._20_4_ = fVar190 * local_138._20_4_;
    auVar37._24_4_ = fVar89 * local_138._24_4_;
    auVar37._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(local_78,auVar108,auVar37);
    auVar38._4_4_ = (float)local_648._4_4_ * fVar186;
    auVar38._0_4_ = (float)local_648._0_4_ * fVar265;
    auVar38._8_4_ = (float)uStack_640 * fVar187;
    auVar38._12_4_ = uStack_640._4_4_ * fVar188;
    auVar38._16_4_ = (float)uStack_638 * fVar189;
    auVar38._20_4_ = uStack_638._4_4_ * fVar190;
    auVar38._24_4_ = (float)uStack_630 * fVar89;
    auVar38._28_4_ = 0;
    auVar245 = vfnmadd231ps_fma(auVar38,auVar108,local_4e8);
    auVar130._0_4_ = fVar87 * fVar265;
    auVar130._4_4_ = fVar144 * fVar186;
    auVar130._8_4_ = fVar63 * fVar187;
    auVar130._12_4_ = fVar222 * fVar188;
    auVar130._16_4_ = fVar189 * 0.0;
    auVar130._20_4_ = fVar190 * 0.0;
    auVar130._24_4_ = fVar89 * 0.0;
    auVar130._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar130,auVar108,auVar252);
    auVar39._4_4_ = fVar186 * fStack_f4;
    auVar39._0_4_ = fVar265 * local_f8;
    auVar39._8_4_ = fVar187 * fStack_f0;
    auVar39._12_4_ = fVar188 * fStack_ec;
    auVar39._16_4_ = fVar189 * fStack_e8;
    auVar39._20_4_ = fVar190 * fStack_e4;
    auVar39._24_4_ = fVar89 * fStack_e0;
    auVar39._28_4_ = fVar264;
    auVar277 = vfnmadd213ps_fma(local_b8,auVar108,auVar39);
    auVar40._4_4_ = fVar186 * local_d8._4_4_;
    auVar40._0_4_ = fVar265 * local_d8._0_4_;
    auVar40._8_4_ = fVar187 * local_d8._8_4_;
    auVar40._12_4_ = fVar188 * local_d8._12_4_;
    auVar40._16_4_ = fVar189 * local_d8._16_4_;
    auVar40._20_4_ = fVar190 * local_d8._20_4_;
    auVar40._24_4_ = fVar89 * local_d8._24_4_;
    auVar40._28_4_ = fVar264;
    auVar12 = vfnmadd213ps_fma(auVar17,auVar108,auVar40);
    auVar220 = ZEXT1664(auVar12);
    auVar41._4_4_ = local_268._4_4_ * fVar186;
    auVar41._0_4_ = local_268._0_4_ * fVar265;
    auVar41._8_4_ = local_268._8_4_ * fVar187;
    auVar41._12_4_ = local_268._12_4_ * fVar188;
    auVar41._16_4_ = local_268._16_4_ * fVar189;
    auVar41._20_4_ = local_268._20_4_ * fVar190;
    auVar41._24_4_ = local_268._24_4_ * fVar89;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar134 = vfnmadd231ps_fma(auVar41,_local_418,auVar108);
    auVar14 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar13 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar7));
    auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar245));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar245));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar277));
    auVar14 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar277));
    auVar16 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar134));
    auVar9 = vminps_avx(auVar9,auVar16);
    auVar9 = vminps_avx(auVar15,auVar9);
    auVar15 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar134));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar48._4_4_ = fStack_224;
    auVar48._0_4_ = local_228;
    auVar48._8_4_ = fStack_220;
    auVar48._12_4_ = fStack_21c;
    auVar48._16_4_ = fStack_218;
    auVar48._20_4_ = fStack_214;
    auVar48._24_4_ = fStack_210;
    auVar48._28_4_ = fStack_20c;
    auVar13 = vcmpps_avx(auVar9,auVar48,2);
    auVar46._4_4_ = fStack_244;
    auVar46._0_4_ = local_248;
    auVar46._8_4_ = fStack_240;
    auVar46._12_4_ = fStack_23c;
    auVar46._16_4_ = fStack_238;
    auVar46._20_4_ = fStack_234;
    auVar46._24_4_ = fStack_230;
    auVar46._28_4_ = fStack_22c;
    auVar14 = vcmpps_avx(auVar14,auVar46,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar81 = vandps_avx(local_158,auVar81);
    auVar14 = auVar81 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar13,auVar81);
      uVar57 = vmovmskps_avx(auVar81);
      if (uVar57 != 0) {
        auStack_3e8[uVar51] = uVar57 & 0xff;
        uVar90 = vmovlps_avx(local_338);
        *(undefined8 *)(&uStack_208 + uVar51 * 2) = uVar90;
        uVar55 = vmovlps_avx(auVar68);
        auStack_58[uVar51] = uVar55;
        uVar51 = (ulong)((int)uVar51 + 1);
      }
    }
  }
LAB_015fd285:
  if ((int)uVar51 != 0) {
    uVar58 = (ulong)((int)uVar51 - 1);
    uVar53 = auStack_3e8[uVar58];
    uVar57 = (&uStack_208)[uVar58 * 2];
    fVar86 = afStack_204[uVar58 * 2];
    iVar18 = 0;
    for (uVar55 = (ulong)uVar53; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      iVar18 = iVar18 + 1;
    }
    uVar53 = uVar53 - 1 & uVar53;
    if (uVar53 == 0) {
      uVar51 = uVar58;
    }
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_58[uVar58];
    auStack_3e8[uVar58] = uVar53;
    fVar88 = (float)(iVar18 + 1) * 0.14285715;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * (float)iVar18 * 0.14285715)),ZEXT416(uVar57),
                             ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * fVar88)),ZEXT416(uVar57),
                             ZEXT416((uint)(1.0 - fVar88)));
    fVar88 = auVar8._0_4_;
    auVar185._0_4_ = auVar7._0_4_;
    fVar86 = fVar88 - auVar185._0_4_;
    if (fVar86 < 0.16666667) {
      auVar277 = vshufps_avx(auVar68,auVar68,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = 0x3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar12 = vsubps_avx(auVar97,auVar277);
      fVar121 = auVar277._0_4_;
      auVar137._0_4_ = fVar121 * fVar132;
      fVar85 = auVar277._4_4_;
      auVar137._4_4_ = fVar85 * fVar143;
      fVar87 = auVar277._8_4_;
      auVar137._8_4_ = fVar87 * fVar132;
      fVar144 = auVar277._12_4_;
      auVar137._12_4_ = fVar144 * fVar143;
      auVar149._0_4_ = fVar121 * fVar253;
      auVar149._4_4_ = fVar85 * fVar263;
      auVar149._8_4_ = fVar87 * fVar253;
      auVar149._12_4_ = fVar144 * fVar263;
      auVar169._0_4_ = fVar121 * fVar191;
      auVar169._4_4_ = fVar85 * fVar204;
      auVar169._8_4_ = fVar87 * fVar191;
      auVar169._12_4_ = fVar144 * fVar204;
      auVar70._0_4_ = fVar121 * fVar205;
      auVar70._4_4_ = fVar85 * fVar221;
      auVar70._8_4_ = fVar87 * fVar205;
      auVar70._12_4_ = fVar144 * fVar221;
      auVar277 = vfmadd231ps_fma(auVar137,auVar12,auVar179);
      auVar92 = vfmadd231ps_fma(auVar149,auVar12,auVar226);
      auVar245 = vfmadd231ps_fma(auVar169,auVar12,auVar244);
      auVar12 = vfmadd231ps_fma(auVar70,auVar12,auVar256);
      auVar131._16_16_ = auVar277;
      auVar131._0_16_ = auVar277;
      auVar142._16_16_ = auVar92;
      auVar142._0_16_ = auVar92;
      auVar157._16_16_ = auVar245;
      auVar157._0_16_ = auVar245;
      auVar185._4_4_ = auVar185._0_4_;
      auVar185._8_4_ = auVar185._0_4_;
      auVar185._12_4_ = auVar185._0_4_;
      auVar185._20_4_ = fVar88;
      auVar185._16_4_ = fVar88;
      auVar185._24_4_ = fVar88;
      auVar185._28_4_ = fVar88;
      auVar81 = vsubps_avx(auVar142,auVar131);
      auVar92 = vfmadd213ps_fma(auVar81,auVar185,auVar131);
      auVar81 = vsubps_avx(auVar157,auVar142);
      auVar73 = vfmadd213ps_fma(auVar81,auVar185,auVar142);
      auVar277 = vsubps_avx(auVar12,auVar245);
      auVar83._16_16_ = auVar277;
      auVar83._0_16_ = auVar277;
      auVar277 = vfmadd213ps_fma(auVar83,auVar185,auVar157);
      auVar81 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar92));
      auVar12 = vfmadd213ps_fma(auVar81,auVar185,ZEXT1632(auVar92));
      auVar81 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar73));
      auVar277 = vfmadd213ps_fma(auVar81,auVar185,ZEXT1632(auVar73));
      auVar81 = vsubps_avx(ZEXT1632(auVar277),ZEXT1632(auVar12));
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar81,auVar185);
      fVar222 = auVar81._4_4_ * 3.0;
      local_4e8._0_4_ = fVar86;
      fVar121 = fVar86 * 0.33333334;
      local_268._0_8_ =
           CONCAT44(auVar91._4_4_ + fVar121 * fVar222,auVar91._0_4_ + fVar121 * auVar81._0_4_ * 3.0)
      ;
      local_268._8_4_ = auVar91._8_4_ + fVar121 * auVar81._8_4_ * 3.0;
      local_268._12_4_ = auVar91._12_4_ + fVar121 * auVar81._12_4_ * 3.0;
      auVar12 = vshufpd_avx(auVar91,auVar91,3);
      auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_438 = auVar12;
      auVar277 = vsubps_avx(auVar12,auVar91);
      _local_418 = auVar92;
      auVar245 = vsubps_avx(auVar92,(undefined1  [16])0x0);
      auVar71._0_4_ = auVar277._0_4_ + auVar245._0_4_;
      auVar71._4_4_ = auVar277._4_4_ + auVar245._4_4_;
      auVar71._8_4_ = auVar277._8_4_ + auVar245._8_4_;
      auVar71._12_4_ = auVar277._12_4_ + auVar245._12_4_;
      auVar277 = vshufps_avx(auVar91,auVar91,0xb1);
      auVar245 = vshufps_avx(local_268._0_16_,local_268._0_16_,0xb1);
      auVar269._4_4_ = auVar71._0_4_;
      auVar269._0_4_ = auVar71._0_4_;
      auVar269._8_4_ = auVar71._0_4_;
      auVar269._12_4_ = auVar71._0_4_;
      auVar73 = vshufps_avx(auVar71,auVar71,0x55);
      fVar85 = auVar73._0_4_;
      auVar72._0_4_ = fVar85 * auVar277._0_4_;
      fVar87 = auVar73._4_4_;
      auVar72._4_4_ = fVar87 * auVar277._4_4_;
      fVar144 = auVar73._8_4_;
      auVar72._8_4_ = fVar144 * auVar277._8_4_;
      fVar63 = auVar73._12_4_;
      auVar72._12_4_ = fVar63 * auVar277._12_4_;
      auVar150._0_4_ = fVar85 * auVar245._0_4_;
      auVar150._4_4_ = fVar87 * auVar245._4_4_;
      auVar150._8_4_ = fVar144 * auVar245._8_4_;
      auVar150._12_4_ = fVar63 * auVar245._12_4_;
      auVar134 = vfmadd231ps_fma(auVar72,auVar269,auVar91);
      auVar237 = vfmadd231ps_fma(auVar150,auVar269,local_268._0_16_);
      auVar245 = vshufps_avx(auVar134,auVar134,0xe8);
      auVar73 = vshufps_avx(auVar237,auVar237,0xe8);
      auVar277 = vcmpps_avx(auVar245,auVar73,1);
      uVar57 = vextractps_avx(auVar277,0);
      auVar133 = auVar237;
      if ((uVar57 & 1) == 0) {
        auVar133 = auVar134;
      }
      auVar123._0_4_ = fVar121 * auVar81._16_4_ * 3.0;
      auVar123._4_4_ = fVar121 * fVar222;
      auVar123._8_4_ = fVar121 * auVar81._24_4_ * 3.0;
      auVar123._12_4_ = fVar121 * auVar220._28_4_;
      local_288._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar123);
      auVar124 = vshufps_avx(local_288._0_16_,local_288._0_16_,0xb1);
      auVar145 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar180._0_4_ = fVar85 * auVar124._0_4_;
      auVar180._4_4_ = fVar87 * auVar124._4_4_;
      auVar180._8_4_ = fVar144 * auVar124._8_4_;
      auVar180._12_4_ = fVar63 * auVar124._12_4_;
      auVar197._0_4_ = auVar145._0_4_ * fVar85;
      auVar197._4_4_ = auVar145._4_4_ * fVar87;
      auVar197._8_4_ = auVar145._8_4_ * fVar144;
      auVar197._12_4_ = auVar145._12_4_ * fVar63;
      auVar176 = vfmadd231ps_fma(auVar180,auVar269,local_288._0_16_);
      auVar192 = vfmadd231ps_fma(auVar197,(undefined1  [16])0x0,auVar269);
      auVar145 = vshufps_avx(auVar176,auVar176,0xe8);
      auVar146 = vshufps_avx(auVar192,auVar192,0xe8);
      auVar220 = ZEXT1664(auVar146);
      auVar124 = vcmpps_avx(auVar145,auVar146,1);
      uVar57 = vextractps_avx(auVar124,0);
      auVar193 = auVar192;
      if ((uVar57 & 1) == 0) {
        auVar193 = auVar176;
      }
      auVar133 = vmaxss_avx(auVar193,auVar133);
      auVar245 = vminps_avx(auVar245,auVar73);
      auVar73 = vminps_avx(auVar145,auVar146);
      auVar73 = vminps_avx(auVar245,auVar73);
      auVar277 = vshufps_avx(auVar277,auVar277,0x55);
      auVar277 = vblendps_avx(auVar277,auVar124,2);
      auVar124 = vpslld_avx(auVar277,0x1f);
      auVar277 = vshufpd_avx(auVar237,auVar237,1);
      auVar277 = vinsertps_avx(auVar277,auVar192,0x9c);
      auVar245 = vshufpd_avx(auVar134,auVar134,1);
      auVar245 = vinsertps_avx(auVar245,auVar176,0x9c);
      auVar277 = vblendvps_avx(auVar245,auVar277,auVar124);
      auVar245 = vmovshdup_avx(auVar277);
      auVar277 = vmaxss_avx(auVar245,auVar277);
      fVar144 = auVar73._0_4_;
      auVar245 = vmovshdup_avx(auVar73);
      fVar87 = auVar277._0_4_;
      fVar121 = auVar245._0_4_;
      fVar85 = auVar133._0_4_;
      if (((0.0001 <= fVar144) || (fVar87 <= -0.0001)) && (0.0001 <= fVar121 || fVar87 <= -0.0001))
      goto code_r0x015fd598;
      goto LAB_015fd5be;
    }
    local_338 = vinsertps_avx(auVar7,auVar8,0x10);
    goto LAB_015fccd2;
  }
  if (bVar49) {
    return bVar49;
  }
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar80._4_4_ = uVar62;
  auVar80._0_4_ = uVar62;
  auVar80._8_4_ = uVar62;
  auVar80._12_4_ = uVar62;
  auVar7 = vcmpps_avx(local_348,auVar80,2);
  uVar54 = vmovmskps_avx(auVar7);
  uVar50 = uVar50 & uVar50 + 0xf & uVar54;
  if (uVar50 == 0) {
    return bVar49;
  }
  goto LAB_015fc57c;
code_r0x015fd598:
  auVar245 = vcmpps_avx(auVar245,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar134 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar245 = vandps_avx(auVar134,auVar245);
  if (fVar85 <= -0.0001 || (auVar245 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_015fd285;
LAB_015fd5be:
  auVar134 = vcmpps_avx(auVar73,_DAT_01f7aa10,1);
  auVar237 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar245 = vcmpss_avx(auVar133,ZEXT816(0) << 0x20,1);
  auVar112._8_4_ = 0xbf800000;
  auVar112._0_8_ = 0xbf800000bf800000;
  auVar112._12_4_ = 0xbf800000;
  auVar245 = vblendvps_avx(auVar97,auVar112,auVar245);
  auVar134 = vblendvps_avx(auVar97,auVar112,auVar134);
  fVar222 = auVar134._0_4_;
  fVar63 = auVar245._0_4_;
  auVar245 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar222 == fVar63) && (!NAN(fVar222) && !NAN(fVar63))) {
    auVar245 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar222 == fVar63) && (!NAN(fVar222) && !NAN(fVar63))) {
    auVar237 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar134 = vmovshdup_avx(auVar134);
  fVar264 = auVar134._0_4_;
  if ((fVar222 != fVar264) || (NAN(fVar222) || NAN(fVar264))) {
    auVar181._12_4_ = 0;
    auVar181._0_12_ = ZEXT812(0);
    auVar181 = auVar181 << 0x20;
    if ((fVar121 != fVar144) || (NAN(fVar121) || NAN(fVar144))) {
      auVar125._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar125._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar125._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar126._0_4_ = -fVar144 / (fVar121 - fVar144);
      auVar126._4_12_ = auVar125._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar181,auVar126);
      auVar134 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar144 != 0.0) || (auVar134 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar144))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar134 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar245 = vminss_avx(auVar245,auVar73);
    auVar237 = vmaxss_avx(auVar134,auVar237);
  }
  else {
    auVar42._12_4_ = 0;
    auVar42._0_12_ = ZEXT812(0);
    auVar181 = auVar42 << 0x20;
  }
  auVar277 = vcmpss_avx(auVar277,auVar181,1);
  auVar113._8_4_ = 0xbf800000;
  auVar113._0_8_ = 0xbf800000bf800000;
  auVar113._12_4_ = 0xbf800000;
  auVar277 = vblendvps_avx(auVar97,auVar113,auVar277);
  fVar121 = auVar277._0_4_;
  auVar277 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar63 != fVar121) || (NAN(fVar63) || NAN(fVar121))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar74._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = auVar133._8_4_ ^ 0x80000000;
      auVar74._12_4_ = auVar133._12_4_ ^ 0x80000000;
      auVar127._0_4_ = -fVar85 / (fVar87 - fVar85);
      auVar127._4_12_ = auVar74._4_12_;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar181,auVar127);
      auVar134 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      if ((fVar85 != 0.0) || (auVar134 = auVar277, NAN(fVar85))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar134 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar245 = vminss_avx(auVar245,auVar73);
    auVar237 = vmaxss_avx(auVar134,auVar237);
  }
  if ((fVar264 != fVar121) || (NAN(fVar264) || NAN(fVar121))) {
    auVar245 = vminss_avx(auVar245,auVar277);
    auVar237 = vmaxss_avx(auVar277,auVar237);
  }
  auVar245 = vmaxss_avx(auVar181,auVar245);
  auVar73 = vminss_avx(auVar237,auVar277);
  if (auVar73._0_4_ < auVar245._0_4_) goto LAB_015fd285;
  auVar245 = vmaxss_avx(auVar181,ZEXT416((uint)(auVar245._0_4_ + -0.1)));
  auVar277 = vminss_avx(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar277);
  auVar138._0_8_ = auVar91._0_8_;
  auVar138._8_8_ = auVar138._0_8_;
  auVar212._8_8_ = local_268._0_8_;
  auVar212._0_8_ = local_268._0_8_;
  auVar227._8_8_ = local_288._0_8_;
  auVar227._0_8_ = local_288._0_8_;
  auVar73 = vshufpd_avx(local_268._0_16_,local_268._0_16_,3);
  auVar134 = vshufpd_avx(local_288._0_16_,local_288._0_16_,3);
  auVar237 = vshufps_avx(auVar245,auVar277,0);
  auVar91 = vsubps_avx(auVar97,auVar237);
  local_438._0_4_ = auVar12._0_4_;
  local_438._4_4_ = auVar12._4_4_;
  fStack_430 = auVar12._8_4_;
  fStack_42c = auVar12._12_4_;
  fVar121 = auVar237._0_4_;
  auVar75._0_4_ = fVar121 * (float)local_438._0_4_;
  fVar85 = auVar237._4_4_;
  auVar75._4_4_ = fVar85 * (float)local_438._4_4_;
  fVar87 = auVar237._8_4_;
  auVar75._8_4_ = fVar87 * fStack_430;
  fVar144 = auVar237._12_4_;
  auVar75._12_4_ = fVar144 * fStack_42c;
  auVar170._0_4_ = fVar121 * auVar73._0_4_;
  auVar170._4_4_ = fVar85 * auVar73._4_4_;
  auVar170._8_4_ = fVar87 * auVar73._8_4_;
  auVar170._12_4_ = fVar144 * auVar73._12_4_;
  auVar182._0_4_ = fVar121 * auVar134._0_4_;
  auVar182._4_4_ = fVar85 * auVar134._4_4_;
  auVar182._8_4_ = fVar87 * auVar134._8_4_;
  auVar182._12_4_ = fVar144 * auVar134._12_4_;
  local_418._0_4_ = auVar92._0_4_;
  local_418._4_4_ = auVar92._4_4_;
  fStack_410 = auVar92._8_4_;
  fStack_40c = auVar92._12_4_;
  auVar198._0_4_ = fVar121 * (float)local_418._0_4_;
  auVar198._4_4_ = fVar85 * (float)local_418._4_4_;
  auVar198._8_4_ = fVar87 * fStack_410;
  auVar198._12_4_ = fVar144 * fStack_40c;
  auVar73 = vfmadd231ps_fma(auVar75,auVar91,auVar138);
  auVar134 = vfmadd231ps_fma(auVar170,auVar91,auVar212);
  auVar237 = vfmadd231ps_fma(auVar182,auVar91,auVar227);
  auVar91 = vfmadd231ps_fma(auVar198,auVar91,ZEXT816(0));
  auVar12 = vmovshdup_avx(auVar68);
  auVar176 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar245._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar245._0_4_)));
  auVar192 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar277._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar277._0_4_)));
  fVar121 = 1.0 / fVar86;
  auVar277 = vsubps_avx(auVar134,auVar73);
  auVar213._0_4_ = auVar277._0_4_ * 3.0;
  auVar213._4_4_ = auVar277._4_4_ * 3.0;
  auVar213._8_4_ = auVar277._8_4_ * 3.0;
  auVar213._12_4_ = auVar277._12_4_ * 3.0;
  auVar277 = vsubps_avx(auVar237,auVar134);
  auVar228._0_4_ = auVar277._0_4_ * 3.0;
  auVar228._4_4_ = auVar277._4_4_ * 3.0;
  auVar228._8_4_ = auVar277._8_4_ * 3.0;
  auVar228._12_4_ = auVar277._12_4_ * 3.0;
  auVar277 = vsubps_avx(auVar91,auVar237);
  auVar238._0_4_ = auVar277._0_4_ * 3.0;
  auVar238._4_4_ = auVar277._4_4_ * 3.0;
  auVar238._8_4_ = auVar277._8_4_ * 3.0;
  auVar238._12_4_ = auVar277._12_4_ * 3.0;
  auVar12 = vminps_avx(auVar228,auVar238);
  auVar277 = vmaxps_avx(auVar228,auVar238);
  auVar12 = vminps_avx(auVar213,auVar12);
  auVar277 = vmaxps_avx(auVar213,auVar277);
  auVar92 = vshufpd_avx(auVar12,auVar12,3);
  auVar245 = vshufpd_avx(auVar277,auVar277,3);
  auVar12 = vminps_avx(auVar12,auVar92);
  auVar277 = vmaxps_avx(auVar277,auVar245);
  auVar229._0_4_ = auVar12._0_4_ * fVar121;
  auVar229._4_4_ = auVar12._4_4_ * fVar121;
  auVar229._8_4_ = auVar12._8_4_ * fVar121;
  auVar229._12_4_ = auVar12._12_4_ * fVar121;
  auVar214._0_4_ = auVar277._0_4_ * fVar121;
  auVar214._4_4_ = auVar277._4_4_ * fVar121;
  auVar214._8_4_ = auVar277._8_4_ * fVar121;
  auVar214._12_4_ = auVar277._12_4_ * fVar121;
  fVar121 = 1.0 / (auVar192._0_4_ - auVar176._0_4_);
  auVar277 = vshufpd_avx(auVar73,auVar73,3);
  auVar12 = vshufpd_avx(auVar134,auVar134,3);
  auVar92 = vshufpd_avx(auVar237,auVar237,3);
  auVar245 = vshufpd_avx(auVar91,auVar91,3);
  auVar277 = vsubps_avx(auVar277,auVar73);
  auVar73 = vsubps_avx(auVar12,auVar134);
  auVar134 = vsubps_avx(auVar92,auVar237);
  auVar245 = vsubps_avx(auVar245,auVar91);
  auVar12 = vminps_avx(auVar277,auVar73);
  auVar277 = vmaxps_avx(auVar277,auVar73);
  auVar92 = vminps_avx(auVar134,auVar245);
  auVar92 = vminps_avx(auVar12,auVar92);
  auVar12 = vmaxps_avx(auVar134,auVar245);
  auVar277 = vmaxps_avx(auVar277,auVar12);
  auVar257._0_4_ = fVar121 * auVar92._0_4_;
  auVar257._4_4_ = fVar121 * auVar92._4_4_;
  auVar257._8_4_ = fVar121 * auVar92._8_4_;
  auVar257._12_4_ = fVar121 * auVar92._12_4_;
  auVar246._0_4_ = fVar121 * auVar277._0_4_;
  auVar246._4_4_ = fVar121 * auVar277._4_4_;
  auVar246._8_4_ = fVar121 * auVar277._8_4_;
  auVar246._12_4_ = fVar121 * auVar277._12_4_;
  auVar245 = vinsertps_avx(auVar7,auVar176,0x10);
  auVar73 = vinsertps_avx(auVar8,auVar192,0x10);
  auVar239._0_4_ = (auVar245._0_4_ + auVar73._0_4_) * 0.5;
  auVar239._4_4_ = (auVar245._4_4_ + auVar73._4_4_) * 0.5;
  auVar239._8_4_ = (auVar245._8_4_ + auVar73._8_4_) * 0.5;
  auVar239._12_4_ = (auVar245._12_4_ + auVar73._12_4_) * 0.5;
  auVar76._4_4_ = auVar239._0_4_;
  auVar76._0_4_ = auVar239._0_4_;
  auVar76._8_4_ = auVar239._0_4_;
  auVar76._12_4_ = auVar239._0_4_;
  auVar277 = vfmadd213ps_fma(local_298,auVar76,auVar10);
  auVar12 = vfmadd213ps_fma(local_2a8,auVar76,auVar11);
  auVar92 = vfmadd213ps_fma(local_2b8,auVar76,local_3f8);
  auVar8 = vsubps_avx(auVar12,auVar277);
  auVar277 = vfmadd213ps_fma(auVar8,auVar76,auVar277);
  auVar8 = vsubps_avx(auVar92,auVar12);
  auVar8 = vfmadd213ps_fma(auVar8,auVar76,auVar12);
  auVar8 = vsubps_avx(auVar8,auVar277);
  auVar277 = vfmadd231ps_fma(auVar277,auVar8,auVar76);
  auVar77._0_8_ = CONCAT44(auVar8._4_4_ * 3.0,auVar8._0_4_ * 3.0);
  auVar77._8_4_ = auVar8._8_4_ * 3.0;
  auVar77._12_4_ = auVar8._12_4_ * 3.0;
  auVar270._8_8_ = auVar277._0_8_;
  auVar270._0_8_ = auVar277._0_8_;
  auVar8 = vshufpd_avx(auVar277,auVar277,3);
  auVar277 = vshufps_avx(auVar239,auVar239,0x55);
  auVar237 = vsubps_avx(auVar8,auVar270);
  auVar133 = vfmadd231ps_fma(auVar270,auVar277,auVar237);
  auVar278._8_8_ = auVar77._0_8_;
  auVar278._0_8_ = auVar77._0_8_;
  auVar8 = vshufpd_avx(auVar77,auVar77,3);
  auVar8 = vsubps_avx(auVar8,auVar278);
  auVar91 = vfmadd213ps_fma(auVar8,auVar277,auVar278);
  auVar277 = vmovshdup_avx(auVar91);
  auVar279._0_8_ = auVar277._0_8_ ^ 0x8000000080000000;
  auVar279._8_4_ = auVar277._8_4_ ^ 0x80000000;
  auVar279._12_4_ = auVar277._12_4_ ^ 0x80000000;
  auVar12 = vmovshdup_avx(auVar237);
  auVar8 = vunpcklps_avx(auVar12,auVar279);
  auVar92 = vshufps_avx(auVar8,auVar279,4);
  auVar134 = vshufps_avx(auVar239,auVar239,0x54);
  auVar128._0_8_ = auVar237._0_8_ ^ 0x8000000080000000;
  auVar128._8_4_ = auVar237._8_4_ ^ 0x80000000;
  auVar128._12_4_ = auVar237._12_4_ ^ 0x80000000;
  auVar8 = vmovlhps_avx(auVar128,auVar91);
  auVar8 = vshufps_avx(auVar8,auVar91,8);
  auVar277 = vfmsub231ss_fma(ZEXT416((uint)(auVar237._0_4_ * auVar277._0_4_)),auVar12,auVar91);
  uVar62 = auVar277._0_4_;
  auVar78._4_4_ = uVar62;
  auVar78._0_4_ = uVar62;
  auVar78._8_4_ = uVar62;
  auVar78._12_4_ = uVar62;
  auVar277 = vdivps_avx(auVar92,auVar78);
  auVar12 = vdivps_avx(auVar8,auVar78);
  fVar87 = auVar133._0_4_;
  fVar121 = auVar277._0_4_;
  auVar8 = vshufps_avx(auVar133,auVar133,0x55);
  fVar85 = auVar12._0_4_;
  auVar79._0_4_ = fVar87 * fVar121 + auVar8._0_4_ * fVar85;
  auVar79._4_4_ = fVar87 * auVar277._4_4_ + auVar8._4_4_ * auVar12._4_4_;
  auVar79._8_4_ = fVar87 * auVar277._8_4_ + auVar8._8_4_ * auVar12._8_4_;
  auVar79._12_4_ = fVar87 * auVar277._12_4_ + auVar8._12_4_ * auVar12._12_4_;
  auVar146 = vsubps_avx(auVar134,auVar79);
  auVar134 = vmovshdup_avx(auVar277);
  auVar8 = vinsertps_avx(auVar229,auVar257,0x1c);
  auVar151._0_4_ = auVar134._0_4_ * auVar8._0_4_;
  auVar151._4_4_ = auVar134._4_4_ * auVar8._4_4_;
  auVar151._8_4_ = auVar134._8_4_ * auVar8._8_4_;
  auVar151._12_4_ = auVar134._12_4_ * auVar8._12_4_;
  auVar92 = vinsertps_avx(auVar214,auVar246,0x1c);
  auVar98._0_4_ = auVar92._0_4_ * auVar134._0_4_;
  auVar98._4_4_ = auVar92._4_4_ * auVar134._4_4_;
  auVar98._8_4_ = auVar92._8_4_ * auVar134._8_4_;
  auVar98._12_4_ = auVar92._12_4_ * auVar134._12_4_;
  auVar133 = vminps_avx(auVar151,auVar98);
  auVar91 = vmaxps_avx(auVar98,auVar151);
  auVar134 = vinsertps_avx(auVar257,auVar229,0x4c);
  auVar124 = vmovshdup_avx(auVar12);
  auVar237 = vinsertps_avx(auVar246,auVar214,0x4c);
  auVar247._0_4_ = auVar124._0_4_ * auVar134._0_4_;
  auVar247._4_4_ = auVar124._4_4_ * auVar134._4_4_;
  auVar247._8_4_ = auVar124._8_4_ * auVar134._8_4_;
  auVar247._12_4_ = auVar124._12_4_ * auVar134._12_4_;
  auVar230._0_4_ = auVar124._0_4_ * auVar237._0_4_;
  auVar230._4_4_ = auVar124._4_4_ * auVar237._4_4_;
  auVar230._8_4_ = auVar124._8_4_ * auVar237._8_4_;
  auVar230._12_4_ = auVar124._12_4_ * auVar237._12_4_;
  auVar124 = vminps_avx(auVar247,auVar230);
  auVar258._0_4_ = auVar133._0_4_ + auVar124._0_4_;
  auVar258._4_4_ = auVar133._4_4_ + auVar124._4_4_;
  auVar258._8_4_ = auVar133._8_4_ + auVar124._8_4_;
  auVar258._12_4_ = auVar133._12_4_ + auVar124._12_4_;
  auVar133 = vmaxps_avx(auVar230,auVar247);
  auVar99._0_4_ = auVar133._0_4_ + auVar91._0_4_;
  auVar99._4_4_ = auVar133._4_4_ + auVar91._4_4_;
  auVar99._8_4_ = auVar133._8_4_ + auVar91._8_4_;
  auVar99._12_4_ = auVar133._12_4_ + auVar91._12_4_;
  auVar231._8_8_ = 0x3f80000000000000;
  auVar231._0_8_ = 0x3f80000000000000;
  auVar91 = vsubps_avx(auVar231,auVar99);
  auVar133 = vsubps_avx(auVar231,auVar258);
  auVar124 = vsubps_avx(auVar245,auVar239);
  auVar145 = vsubps_avx(auVar73,auVar239);
  auVar114._0_4_ = fVar121 * auVar8._0_4_;
  auVar114._4_4_ = fVar121 * auVar8._4_4_;
  auVar114._8_4_ = fVar121 * auVar8._8_4_;
  auVar114._12_4_ = fVar121 * auVar8._12_4_;
  auVar259._0_4_ = fVar121 * auVar92._0_4_;
  auVar259._4_4_ = fVar121 * auVar92._4_4_;
  auVar259._8_4_ = fVar121 * auVar92._8_4_;
  auVar259._12_4_ = fVar121 * auVar92._12_4_;
  auVar92 = vminps_avx(auVar114,auVar259);
  auVar8 = vmaxps_avx(auVar259,auVar114);
  auVar152._0_4_ = fVar85 * auVar134._0_4_;
  auVar152._4_4_ = fVar85 * auVar134._4_4_;
  auVar152._8_4_ = fVar85 * auVar134._8_4_;
  auVar152._12_4_ = fVar85 * auVar134._12_4_;
  auVar215._0_4_ = fVar85 * auVar237._0_4_;
  auVar215._4_4_ = fVar85 * auVar237._4_4_;
  auVar215._8_4_ = fVar85 * auVar237._8_4_;
  auVar215._12_4_ = fVar85 * auVar237._12_4_;
  auVar134 = vminps_avx(auVar152,auVar215);
  auVar260._0_4_ = auVar92._0_4_ + auVar134._0_4_;
  auVar260._4_4_ = auVar92._4_4_ + auVar134._4_4_;
  auVar260._8_4_ = auVar92._8_4_ + auVar134._8_4_;
  auVar260._12_4_ = auVar92._12_4_ + auVar134._12_4_;
  fVar264 = auVar124._0_4_;
  auVar271._0_4_ = fVar264 * auVar91._0_4_;
  fVar265 = auVar124._4_4_;
  auVar271._4_4_ = fVar265 * auVar91._4_4_;
  fVar186 = auVar124._8_4_;
  auVar271._8_4_ = fVar186 * auVar91._8_4_;
  fVar187 = auVar124._12_4_;
  auVar271._12_4_ = fVar187 * auVar91._12_4_;
  auVar92 = vmaxps_avx(auVar215,auVar152);
  auVar216._0_4_ = fVar264 * auVar133._0_4_;
  auVar216._4_4_ = fVar265 * auVar133._4_4_;
  auVar216._8_4_ = fVar186 * auVar133._8_4_;
  auVar216._12_4_ = fVar187 * auVar133._12_4_;
  fVar87 = auVar145._0_4_;
  auVar100._0_4_ = fVar87 * auVar91._0_4_;
  fVar144 = auVar145._4_4_;
  auVar100._4_4_ = fVar144 * auVar91._4_4_;
  fVar63 = auVar145._8_4_;
  auVar100._8_4_ = fVar63 * auVar91._8_4_;
  fVar222 = auVar145._12_4_;
  auVar100._12_4_ = fVar222 * auVar91._12_4_;
  auVar232._0_4_ = fVar87 * auVar133._0_4_;
  auVar232._4_4_ = fVar144 * auVar133._4_4_;
  auVar232._8_4_ = fVar63 * auVar133._8_4_;
  auVar232._12_4_ = fVar222 * auVar133._12_4_;
  auVar115._0_4_ = auVar8._0_4_ + auVar92._0_4_;
  auVar115._4_4_ = auVar8._4_4_ + auVar92._4_4_;
  auVar115._8_4_ = auVar8._8_4_ + auVar92._8_4_;
  auVar115._12_4_ = auVar8._12_4_ + auVar92._12_4_;
  auVar153._8_8_ = 0x3f800000;
  auVar153._0_8_ = 0x3f800000;
  auVar8 = vsubps_avx(auVar153,auVar115);
  auVar92 = vsubps_avx(auVar153,auVar260);
  auVar261._0_4_ = fVar264 * auVar8._0_4_;
  auVar261._4_4_ = fVar265 * auVar8._4_4_;
  auVar261._8_4_ = fVar186 * auVar8._8_4_;
  auVar261._12_4_ = fVar187 * auVar8._12_4_;
  auVar248._0_4_ = fVar264 * auVar92._0_4_;
  auVar248._4_4_ = fVar265 * auVar92._4_4_;
  auVar248._8_4_ = fVar186 * auVar92._8_4_;
  auVar248._12_4_ = fVar187 * auVar92._12_4_;
  auVar116._0_4_ = fVar87 * auVar8._0_4_;
  auVar116._4_4_ = fVar144 * auVar8._4_4_;
  auVar116._8_4_ = fVar63 * auVar8._8_4_;
  auVar116._12_4_ = fVar222 * auVar8._12_4_;
  auVar154._0_4_ = fVar87 * auVar92._0_4_;
  auVar154._4_4_ = fVar144 * auVar92._4_4_;
  auVar154._8_4_ = fVar63 * auVar92._8_4_;
  auVar154._12_4_ = fVar222 * auVar92._12_4_;
  auVar8 = vminps_avx(auVar261,auVar248);
  auVar92 = vminps_avx(auVar116,auVar154);
  auVar8 = vminps_avx(auVar8,auVar92);
  auVar92 = vmaxps_avx(auVar248,auVar261);
  auVar134 = vmaxps_avx(auVar154,auVar116);
  auVar237 = vminps_avx(auVar271,auVar216);
  auVar91 = vminps_avx(auVar100,auVar232);
  auVar237 = vminps_avx(auVar237,auVar91);
  auVar8 = vhaddps_avx(auVar8,auVar237);
  auVar92 = vmaxps_avx(auVar134,auVar92);
  auVar134 = vmaxps_avx(auVar216,auVar271);
  auVar237 = vmaxps_avx(auVar232,auVar100);
  auVar134 = vmaxps_avx(auVar237,auVar134);
  auVar92 = vhaddps_avx(auVar92,auVar134);
  auVar8 = vshufps_avx(auVar8,auVar8,0xe8);
  auVar92 = vshufps_avx(auVar92,auVar92,0xe8);
  auVar233._0_4_ = auVar146._0_4_ + auVar8._0_4_;
  auVar233._4_4_ = auVar146._4_4_ + auVar8._4_4_;
  auVar233._8_4_ = auVar146._8_4_ + auVar8._8_4_;
  auVar233._12_4_ = auVar146._12_4_ + auVar8._12_4_;
  auVar217._0_4_ = auVar146._0_4_ + auVar92._0_4_;
  auVar217._4_4_ = auVar146._4_4_ + auVar92._4_4_;
  auVar217._8_4_ = auVar146._8_4_ + auVar92._8_4_;
  auVar217._12_4_ = auVar146._12_4_ + auVar92._12_4_;
  auVar220 = ZEXT1664(auVar217);
  auVar8 = vmaxps_avx(auVar245,auVar233);
  auVar92 = vminps_avx(auVar217,auVar73);
  auVar8 = vcmpps_avx(auVar92,auVar8,1);
  auVar8 = vshufps_avx(auVar8,auVar8,0x50);
  if ((auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar8[0xf] < '\0')
  goto LAB_015fd285;
  bVar52 = 0;
  if ((auVar185._0_4_ < auVar233._0_4_) && (bVar52 = 0, auVar217._0_4_ < auVar73._0_4_)) {
    auVar92 = vmovshdup_avx(auVar233);
    auVar8 = vcmpps_avx(auVar217,auVar73,1);
    bVar52 = auVar8[4] & auVar176._0_4_ < auVar92._0_4_;
  }
  if (((3 < (uint)uVar51 || fVar86 < 0.001) | bVar52) == 1) {
    lVar56 = 200;
    auVar220 = ZEXT1664(local_3f8);
    do {
      fVar144 = auVar146._0_4_;
      fVar87 = 1.0 - fVar144;
      fVar86 = fVar87 * fVar87 * fVar87;
      fVar88 = fVar144 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar144 * fVar144 * 3.0;
      auVar139._4_4_ = fVar86;
      auVar139._0_4_ = fVar86;
      auVar139._8_4_ = fVar86;
      auVar139._12_4_ = fVar86;
      auVar117._4_4_ = fVar88;
      auVar117._0_4_ = fVar88;
      auVar117._8_4_ = fVar88;
      auVar117._12_4_ = fVar88;
      auVar101._4_4_ = fVar87;
      auVar101._0_4_ = fVar87;
      auVar101._8_4_ = fVar87;
      auVar101._12_4_ = fVar87;
      fVar144 = fVar144 * fVar144 * fVar144;
      auVar155._0_4_ = (float)local_2c8._0_4_ * fVar144;
      auVar155._4_4_ = (float)local_2c8._4_4_ * fVar144;
      auVar155._8_4_ = fStack_2c0 * fVar144;
      auVar155._12_4_ = fStack_2bc * fVar144;
      auVar7 = vfmadd231ps_fma(auVar155,local_3f8,auVar101);
      auVar7 = vfmadd231ps_fma(auVar7,auVar11,auVar117);
      auVar7 = vfmadd231ps_fma(auVar7,auVar10,auVar139);
      auVar102._8_8_ = auVar7._0_8_;
      auVar102._0_8_ = auVar7._0_8_;
      auVar7 = vshufpd_avx(auVar7,auVar7,3);
      auVar8 = vshufps_avx(auVar146,auVar146,0x55);
      auVar7 = vsubps_avx(auVar7,auVar102);
      auVar8 = vfmadd213ps_fma(auVar7,auVar8,auVar102);
      fVar86 = auVar8._0_4_;
      auVar7 = vshufps_avx(auVar8,auVar8,0x55);
      auVar103._0_4_ = fVar121 * fVar86 + fVar85 * auVar7._0_4_;
      auVar103._4_4_ = auVar277._4_4_ * fVar86 + auVar12._4_4_ * auVar7._4_4_;
      auVar103._8_4_ = auVar277._8_4_ * fVar86 + auVar12._8_4_ * auVar7._8_4_;
      auVar103._12_4_ = auVar277._12_4_ * fVar86 + auVar12._12_4_ * auVar7._12_4_;
      auVar146 = vsubps_avx(auVar146,auVar103);
      auVar7 = vandps_avx(auVar242,auVar8);
      auVar8 = vshufps_avx(auVar7,auVar7,0xf5);
      auVar7 = vmaxss_avx(auVar8,auVar7);
      if (auVar7._0_4_ < fVar84) {
        local_1b8 = auVar146._0_4_;
        if ((0.0 <= local_1b8) && (local_1b8 <= 1.0)) {
          auVar7 = vmovshdup_avx(auVar146);
          fVar86 = auVar7._0_4_;
          if ((0.0 <= fVar86) && (fVar86 <= 1.0)) {
            auVar7 = vinsertps_avx(ZEXT416((uint)(pLVar59->vx).field_0.m128[2]),
                                   ZEXT416(*(uint *)((long)&(pLVar59->vy).field_0 + 8)),0x1c);
            auVar134 = vinsertps_avx(auVar7,ZEXT416(*(uint *)((long)&(pLVar59->vz).field_0 + 8)),
                                     0x28);
            auVar7 = vdpps_avx(auVar134,local_448,0x7f);
            auVar8 = vdpps_avx(auVar134,local_458,0x7f);
            auVar277 = vdpps_avx(auVar134,local_2d8,0x7f);
            auVar12 = vdpps_avx(auVar134,local_2e8,0x7f);
            auVar92 = vdpps_avx(auVar134,local_2f8,0x7f);
            auVar245 = vdpps_avx(auVar134,local_308,0x7f);
            auVar73 = vdpps_avx(auVar134,local_318,0x7f);
            auVar134 = vdpps_avx(auVar134,local_328,0x7f);
            fVar88 = 1.0 - fVar86;
            auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar92._0_4_)),ZEXT416((uint)fVar88),
                                     auVar7);
            auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar245._0_4_ * fVar86)),ZEXT416((uint)fVar88),
                                     auVar8);
            auVar277 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar86)),ZEXT416((uint)fVar88)
                                       ,auVar277);
            auVar220 = ZEXT1664(auVar277);
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar134._0_4_)),ZEXT416((uint)fVar88)
                                      ,auVar12);
            fVar85 = 1.0 - local_1b8;
            fVar86 = fVar85 * local_1b8 * local_1b8 * 3.0;
            fVar144 = local_1b8 * local_1b8 * local_1b8;
            auVar277 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar144)),
                                       ZEXT416((uint)fVar86),auVar277);
            fVar88 = local_1b8 * 3.0 * fVar85 * fVar85;
            auVar8 = vfmadd231ss_fma(auVar277,ZEXT416((uint)fVar88),auVar8);
            fVar121 = fVar85 * fVar85 * fVar85;
            auVar7 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar121),auVar7);
            fVar87 = auVar7._0_4_;
            if ((fVar61 <= fVar87) && (fVar63 = *(float *)(ray + k * 4 + 0x80), fVar87 <= fVar63)) {
              pGVar3 = (context->scene->geometries).items[uVar54].ptr;
              if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar60 = false;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar60 = true, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1a8 = vshufps_avx(auVar146,auVar146,0x55);
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar7 = vsubps_avx(auVar199,local_1a8);
                fVar222 = local_1a8._0_4_;
                auVar218._0_4_ = fVar222 * (float)local_478._0_4_;
                fVar264 = local_1a8._4_4_;
                auVar218._4_4_ = fVar264 * (float)local_478._4_4_;
                fVar265 = local_1a8._8_4_;
                auVar218._8_4_ = fVar265 * fStack_470;
                fVar186 = local_1a8._12_4_;
                auVar218._12_4_ = fVar186 * fStack_46c;
                auVar234._0_4_ = fVar222 * (float)local_4b8._0_4_;
                auVar234._4_4_ = fVar264 * (float)local_4b8._4_4_;
                auVar234._8_4_ = fVar265 * fStack_4b0;
                auVar234._12_4_ = fVar186 * fStack_4ac;
                auVar240._0_4_ = fVar222 * (float)local_4c8._0_4_;
                auVar240._4_4_ = fVar264 * (float)local_4c8._4_4_;
                auVar240._8_4_ = fVar265 * fStack_4c0;
                auVar240._12_4_ = fVar186 * fStack_4bc;
                auVar249._0_4_ = fVar222 * fVar158;
                auVar249._4_4_ = fVar264 * fVar173;
                auVar249._8_4_ = fVar265 * fVar174;
                auVar249._12_4_ = fVar186 * fVar175;
                auVar8 = vfmadd231ps_fma(auVar218,auVar7,local_468);
                auVar277 = vfmadd231ps_fma(auVar234,auVar7,local_498);
                auVar12 = vfmadd231ps_fma(auVar240,auVar7,local_4a8);
                auVar92 = vfmadd231ps_fma(auVar249,auVar7,local_488);
                auVar7 = vsubps_avx(auVar277,auVar8);
                auVar8 = vsubps_avx(auVar12,auVar277);
                auVar220 = ZEXT1664(auVar8);
                auVar277 = vsubps_avx(auVar92,auVar12);
                auVar241._0_4_ = auVar8._0_4_ * local_1b8;
                auVar241._4_4_ = auVar8._4_4_ * local_1b8;
                auVar241._8_4_ = auVar8._8_4_ * local_1b8;
                auVar241._12_4_ = auVar8._12_4_ * local_1b8;
                auVar171._4_4_ = fVar85;
                auVar171._0_4_ = fVar85;
                auVar171._8_4_ = fVar85;
                auVar171._12_4_ = fVar85;
                auVar7 = vfmadd231ps_fma(auVar241,auVar171,auVar7);
                auVar200._0_4_ = auVar277._0_4_ * local_1b8;
                auVar200._4_4_ = auVar277._4_4_ * local_1b8;
                auVar200._8_4_ = auVar277._8_4_ * local_1b8;
                auVar200._12_4_ = auVar277._12_4_ * local_1b8;
                auVar277 = vfmadd231ps_fma(auVar200,auVar171,auVar8);
                auVar201._0_4_ = auVar277._0_4_ * local_1b8;
                auVar201._4_4_ = auVar277._4_4_ * local_1b8;
                auVar201._8_4_ = auVar277._8_4_ * local_1b8;
                auVar201._12_4_ = auVar277._12_4_ * local_1b8;
                auVar277 = vfmadd231ps_fma(auVar201,auVar171,auVar7);
                auVar156._0_4_ = fVar144 * (float)local_3a8._0_4_;
                auVar156._4_4_ = fVar144 * (float)local_3a8._4_4_;
                auVar156._8_4_ = fVar144 * fStack_3a0;
                auVar156._12_4_ = fVar144 * fStack_39c;
                auVar118._4_4_ = fVar86;
                auVar118._0_4_ = fVar86;
                auVar118._8_4_ = fVar86;
                auVar118._12_4_ = fVar86;
                auVar7 = vfmadd132ps_fma(auVar118,auVar156,local_398);
                auVar140._4_4_ = fVar88;
                auVar140._0_4_ = fVar88;
                auVar140._8_4_ = fVar88;
                auVar140._12_4_ = fVar88;
                auVar7 = vfmadd132ps_fma(auVar140,auVar7,local_388);
                auVar119._0_4_ = auVar277._0_4_ * 3.0;
                auVar119._4_4_ = auVar277._4_4_ * 3.0;
                auVar119._8_4_ = auVar277._8_4_ * 3.0;
                auVar119._12_4_ = auVar277._12_4_ * 3.0;
                auVar129._4_4_ = fVar121;
                auVar129._0_4_ = fVar121;
                auVar129._8_4_ = fVar121;
                auVar129._12_4_ = fVar121;
                auVar277 = vfmadd132ps_fma(auVar129,auVar7,local_378);
                auVar7 = vshufps_avx(auVar119,auVar119,0xc9);
                auVar141._0_4_ = auVar277._0_4_ * auVar7._0_4_;
                auVar141._4_4_ = auVar277._4_4_ * auVar7._4_4_;
                auVar141._8_4_ = auVar277._8_4_ * auVar7._8_4_;
                auVar141._12_4_ = auVar277._12_4_ * auVar7._12_4_;
                auVar7 = vshufps_avx(auVar277,auVar277,0xc9);
                auVar277 = vfmsub231ps_fma(auVar141,auVar119,auVar7);
                auVar7 = vshufps_avx(auVar277,auVar277,0x55);
                local_1e8[0] = (RTCHitN)auVar7[0];
                local_1e8[1] = (RTCHitN)auVar7[1];
                local_1e8[2] = (RTCHitN)auVar7[2];
                local_1e8[3] = (RTCHitN)auVar7[3];
                local_1e8[4] = (RTCHitN)auVar7[4];
                local_1e8[5] = (RTCHitN)auVar7[5];
                local_1e8[6] = (RTCHitN)auVar7[6];
                local_1e8[7] = (RTCHitN)auVar7[7];
                local_1e8[8] = (RTCHitN)auVar7[8];
                local_1e8[9] = (RTCHitN)auVar7[9];
                local_1e8[10] = (RTCHitN)auVar7[10];
                local_1e8[0xb] = (RTCHitN)auVar7[0xb];
                local_1e8[0xc] = (RTCHitN)auVar7[0xc];
                local_1e8[0xd] = (RTCHitN)auVar7[0xd];
                local_1e8[0xe] = (RTCHitN)auVar7[0xe];
                local_1e8[0xf] = (RTCHitN)auVar7[0xf];
                local_1d8 = vshufps_avx(auVar277,auVar277,0xaa);
                local_1c8 = auVar277._0_4_;
                uStack_1c4 = local_1c8;
                uStack_1c0 = local_1c8;
                uStack_1bc = local_1c8;
                fStack_1b4 = local_1b8;
                fStack_1b0 = local_1b8;
                fStack_1ac = local_1b8;
                local_198 = CONCAT44(uStack_364,local_368);
                uStack_190 = CONCAT44(uStack_35c,uStack_360);
                local_188._4_4_ = uStack_354;
                local_188._0_4_ = local_358;
                local_188._8_4_ = uStack_350;
                local_188._12_4_ = uStack_34c;
                vpcmpeqd_avx2(ZEXT1632(local_188),ZEXT1632(local_188));
                uStack_174 = context->user->instID[0];
                local_178 = uStack_174;
                uStack_170 = uStack_174;
                uStack_16c = uStack_174;
                uStack_168 = context->user->instPrimID[0];
                uStack_164 = uStack_168;
                uStack_160 = uStack_168;
                uStack_15c = uStack_168;
                *(float *)(ray + k * 4 + 0x80) = fVar87;
                local_508 = *local_4f8;
                local_3d8.valid = (int *)local_508;
                local_3d8.geometryUserPtr = pGVar3->userPtr;
                local_3d8.context = context->user;
                local_3d8.ray = (RTCRayN *)ray;
                local_3d8.hit = local_1e8;
                local_3d8.N = 4;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar220 = ZEXT1664(auVar8);
                  (*pGVar3->occlusionFilterN)(&local_3d8);
                }
                if (local_508 == (undefined1  [16])0x0) {
                  auVar7 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar7 = auVar7 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar220 = ZEXT1664(auVar220._0_16_);
                    (*p_Var6)(&local_3d8);
                  }
                  auVar8 = vpcmpeqd_avx(local_508,_DAT_01f7aa10);
                  auVar7 = auVar8 ^ _DAT_01f7ae20;
                  auVar120._8_4_ = 0xff800000;
                  auVar120._0_8_ = 0xff800000ff800000;
                  auVar120._12_4_ = 0xff800000;
                  auVar8 = vblendvps_avx(auVar120,*(undefined1 (*) [16])(local_3d8.ray + 0x80),
                                         auVar8);
                  *(undefined1 (*) [16])(local_3d8.ray + 0x80) = auVar8;
                }
                auVar104._8_8_ = 0x100000001;
                auVar104._0_8_ = 0x100000001;
                bVar60 = (auVar104 & auVar7) != (undefined1  [16])0x0;
                if (!bVar60) {
                  *(float *)(ray + k * 4 + 0x80) = fVar63;
                }
              }
              bVar49 = (bool)(bVar49 | bVar60);
              pLVar59 = local_4f0;
            }
          }
        }
        break;
      }
      lVar56 = lVar56 + -1;
    } while (lVar56 != 0);
    goto LAB_015fd285;
  }
  local_338 = vinsertps_avx(auVar7,ZEXT416((uint)fVar88),0x10);
  auVar68 = vinsertps_avx(auVar176,ZEXT416((uint)auVar192._0_4_),0x10);
  goto LAB_015fccd2;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }